

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ushort uVar19;
  ushort uVar20;
  ulong uVar21;
  Geometry *pGVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  byte bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [12];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar46;
  size_t sVar47;
  RayHitK<4> *pRVar48;
  int iVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  long lVar52;
  long lVar53;
  long lVar54;
  RTCRayN *pRVar55;
  ulong uVar56;
  long lVar57;
  uint uVar58;
  long lVar59;
  ulong uVar60;
  long lVar61;
  ulong uVar62;
  long lVar63;
  ulong uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  byte bVar71;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar106;
  byte bVar107;
  float fVar108;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar101;
  uint uVar128;
  uint uVar129;
  vint4 ai;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  uint uVar130;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  uint uVar132;
  uint uVar142;
  uint uVar143;
  vint4 ai_2;
  undefined1 auVar133 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar134;
  uint uVar144;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  uint uVar145;
  uint uVar160;
  uint uVar161;
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint uVar162;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar163;
  float fVar172;
  vint4 ai_5;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar166;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar181;
  float fVar182;
  vint4 ai_1;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar183;
  uint uVar184;
  float fVar185;
  float fVar193;
  uint uVar197;
  vint4 bi_1;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  uint uVar194;
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  uint uVar200;
  float fVar201;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar202;
  float fVar210;
  float fVar212;
  vint4 ai_7;
  float fVar203;
  float fVar215;
  undefined1 auVar204 [16];
  float fVar211;
  float fVar213;
  float fVar216;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar214;
  float fVar217;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar223 [16];
  float fVar230;
  float fVar234;
  float fVar238;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar239;
  float fVar240;
  float fVar244;
  float fVar245;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar251;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar246;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar253;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar256;
  float fVar257;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar258 [16];
  float fVar261;
  float fVar265;
  undefined1 auVar259 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  UVIdentity<4> mapUV;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined1 local_14c8 [8];
  float fStack_14c0;
  float fStack_14bc;
  float fStack_1480;
  float fStack_147c;
  float fStack_146c;
  float local_1448;
  float fStack_1444;
  float fStack_1440;
  float fStack_143c;
  vbool<4> valid;
  undefined1 local_1428 [16];
  ulong local_1418;
  ulong local_1410;
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<4>_> *local_13b0;
  float local_1388;
  float fStack_1384;
  float fStack_1380;
  float fStack_137c;
  float local_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  vfloat<4> tNear;
  undefined1 local_12f8 [16];
  undefined1 local_12e8 [16];
  undefined1 local_12d8 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined1 local_1278 [16];
  undefined8 local_1268;
  float fStack_1260;
  float fStack_125c;
  float local_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float local_1248;
  float fStack_1244;
  float fStack_1240;
  float fStack_123c;
  float local_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  long local_1220;
  long local_1218;
  ulong local_1210;
  ulong local_1208;
  ulong local_1200;
  size_t local_11f8;
  RayHitK<4> *local_11f0;
  Scene *local_11e8;
  ulong local_11e0;
  ulong local_11d8;
  ulong local_11d0;
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  vint4 bi_2;
  undefined4 local_1168;
  undefined4 uStack_1164;
  undefined4 uStack_1160;
  undefined4 uStack_115c;
  undefined1 local_1158 [16];
  undefined1 local_1148 [16];
  undefined4 local_1138;
  undefined4 uStack_1134;
  undefined4 uStack_1130;
  undefined4 uStack_112c;
  undefined1 local_1128 [16];
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  uint local_10f8;
  uint uStack_10f4;
  uint uStack_10f0;
  uint uStack_10ec;
  uint local_10e8;
  uint uStack_10e4;
  uint uStack_10e0;
  uint uStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  undefined8 local_1068;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  undefined1 local_1038 [16];
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  vfloat<4> dist;
  vint<4> itime;
  vfloat<4> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined8 uVar186;
  
  local_13b0 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar236 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar216 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar238 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar218 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar253 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar256 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar267 = fVar218 * 0.99999964;
  fVar239 = fVar253 * 0.99999964;
  fVar266 = fVar256 * 0.99999964;
  fVar218 = fVar218 * 1.0000004;
  fVar253 = fVar253 * 1.0000004;
  fVar256 = fVar256 * 1.0000004;
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar60 = uVar62 ^ 0x10;
  local_11d0 = uVar64 ^ 0x10;
  local_11d8 = uVar67 ^ 0x10;
  iVar49 = (tray->tnear).field_0.i[k];
  aVar246.i[1] = iVar49;
  aVar246.i[0] = iVar49;
  aVar246.i[2] = iVar49;
  aVar246.i[3] = iVar49;
  local_1238 = (float)(tray->tfar).field_0.i[k];
  fStack_1234 = local_1238;
  fStack_1230 = local_1238;
  fStack_122c = local_1238;
  lVar52 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
  local_1288 = fVar216;
  fStack_1284 = fVar216;
  fStack_1280 = fVar216;
  fStack_127c = fVar216;
  local_1298 = fVar238;
  fStack_1294 = fVar238;
  fStack_1290 = fVar238;
  fStack_128c = fVar238;
  local_11f0 = ray;
  local_11f8 = k;
  local_11b8 = fVar236;
  fStack_11b4 = fVar236;
  fStack_11b0 = fVar236;
  fStack_11ac = fVar236;
  local_11c8 = fVar218;
  fStack_11c4 = fVar218;
  fStack_11c0 = fVar218;
  fStack_11bc = fVar218;
  local_10a8 = fVar253;
  fStack_10a4 = fVar253;
  fStack_10a0 = fVar253;
  fStack_109c = fVar253;
  local_10b8 = fVar256;
  fStack_10b4 = fVar256;
  fStack_10b0 = fVar256;
  fStack_10ac = fVar256;
  local_10c8 = fVar266;
  fStack_10c4 = fVar266;
  fStack_10c0 = fVar266;
  fStack_10bc = fVar266;
  local_10d8 = fVar267;
  fStack_10d4 = fVar267;
  fStack_10d0 = fVar267;
  fStack_10cc = fVar267;
  local_1200 = uVar62;
  local_1208 = uVar64;
  local_1210 = uVar67;
  bi_2.field_0 = aVar246;
  fVar263 = fVar266;
  fVar240 = fVar266;
  fVar244 = fVar266;
  fVar245 = fVar267;
  fVar163 = fVar267;
  fVar172 = fVar267;
  fVar183 = fVar216;
  fVar193 = fVar216;
  fVar214 = fVar216;
  fVar217 = fVar238;
  fVar260 = fVar238;
  fVar108 = fVar238;
  fVar219 = fVar236;
  fVar227 = fVar236;
  fVar231 = fVar236;
  fVar131 = fVar218;
  fVar202 = fVar218;
  fVar210 = fVar218;
  fVar195 = fVar253;
  fVar198 = fVar253;
  fVar201 = fVar253;
  fVar185 = fVar256;
  fVar196 = fVar256;
  fVar199 = fVar256;
LAB_0029eaae:
  do {
    pSVar46 = local_13b0 + -1;
    local_13b0 = local_13b0 + -1;
    if ((float)pSVar46->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar46->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar65 = (local_13b0->ptr).ptr;
      while ((uVar65 & 8) == 0) {
        uVar56 = uVar65 & 0xfffffffffffffff0;
        fVar212 = *(float *)(ray + k * 4 + 0x70);
        pfVar15 = (float *)(uVar56 + 0x80 + uVar62);
        pfVar14 = (float *)(uVar56 + 0x20 + uVar62);
        auVar175._0_4_ = ((*pfVar15 * fVar212 + *pfVar14) - fVar236) * fVar267;
        auVar175._4_4_ = ((pfVar15[1] * fVar212 + pfVar14[1]) - fVar219) * fVar245;
        auVar175._8_4_ = ((pfVar15[2] * fVar212 + pfVar14[2]) - fVar227) * fVar163;
        auVar175._12_4_ = ((pfVar15[3] * fVar212 + pfVar14[3]) - fVar231) * fVar172;
        pfVar15 = (float *)(uVar56 + 0x80 + uVar64);
        pfVar14 = (float *)(uVar56 + 0x20 + uVar64);
        auVar188._0_4_ = ((*pfVar15 * fVar212 + *pfVar14) - fVar216) * fVar239;
        auVar188._4_4_ = ((pfVar15[1] * fVar212 + pfVar14[1]) - fVar183) * fVar239;
        auVar188._8_4_ = ((pfVar15[2] * fVar212 + pfVar14[2]) - fVar193) * fVar239;
        auVar188._12_4_ = ((pfVar15[3] * fVar212 + pfVar14[3]) - fVar214) * fVar239;
        pfVar15 = (float *)(uVar56 + 0x80 + uVar67);
        pfVar14 = (float *)(uVar56 + 0x20 + uVar67);
        auVar146._0_4_ = ((*pfVar15 * fVar212 + *pfVar14) - fVar238) * fVar266;
        auVar146._4_4_ = ((pfVar15[1] * fVar212 + pfVar14[1]) - fVar217) * fVar263;
        auVar146._8_4_ = ((pfVar15[2] * fVar212 + pfVar14[2]) - fVar260) * fVar240;
        auVar146._12_4_ = ((pfVar15[3] * fVar212 + pfVar14[3]) - fVar108) * fVar244;
        auVar146 = maxps(auVar188,auVar146);
        auVar109 = maxps((undefined1  [16])aVar246,auVar175);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar109,auVar146);
        pfVar15 = (float *)(uVar56 + 0x80 + uVar60);
        pfVar14 = (float *)(uVar56 + 0x20 + uVar60);
        auVar207._0_4_ = ((*pfVar15 * fVar212 + *pfVar14) - fVar236) * fVar218;
        auVar207._4_4_ = ((pfVar15[1] * fVar212 + pfVar14[1]) - fVar219) * fVar131;
        auVar207._8_4_ = ((pfVar15[2] * fVar212 + pfVar14[2]) - fVar227) * fVar202;
        auVar207._12_4_ = ((pfVar15[3] * fVar212 + pfVar14[3]) - fVar231) * fVar210;
        pfVar15 = (float *)(uVar56 + 0x80 + local_11d0);
        pfVar14 = (float *)(uVar56 + 0x20 + local_11d0);
        auVar164._0_4_ = ((*pfVar15 * fVar212 + *pfVar14) - fVar216) * fVar253;
        auVar164._4_4_ = ((pfVar15[1] * fVar212 + pfVar14[1]) - fVar183) * fVar195;
        auVar164._8_4_ = ((pfVar15[2] * fVar212 + pfVar14[2]) - fVar193) * fVar198;
        auVar164._12_4_ = ((pfVar15[3] * fVar212 + pfVar14[3]) - fVar214) * fVar201;
        pfVar15 = (float *)(uVar56 + 0x80 + local_11d8);
        pfVar14 = (float *)(uVar56 + 0x20 + local_11d8);
        auVar177._0_4_ = ((*pfVar15 * fVar212 + *pfVar14) - fVar238) * fVar256;
        auVar177._4_4_ = ((pfVar15[1] * fVar212 + pfVar14[1]) - fVar217) * fVar185;
        auVar177._8_4_ = ((pfVar15[2] * fVar212 + pfVar14[2]) - fVar260) * fVar196;
        auVar177._12_4_ = ((pfVar15[3] * fVar212 + pfVar14[3]) - fVar108) * fVar199;
        auVar146 = minps(auVar164,auVar177);
        auVar109._4_4_ = fStack_1234;
        auVar109._0_4_ = local_1238;
        auVar109._8_4_ = fStack_1230;
        auVar109._12_4_ = fStack_122c;
        auVar109 = minps(auVar109,auVar207);
        auVar109 = minps(auVar109,auVar146);
        if (((uint)uVar65 & 7) == 6) {
          bVar28 = (fVar212 < *(float *)(uVar56 + 0xf0) && *(float *)(uVar56 + 0xe0) <= fVar212) &&
                   tNear.field_0._0_4_ <= auVar109._0_4_;
          bVar29 = (fVar212 < *(float *)(uVar56 + 0xf4) && *(float *)(uVar56 + 0xe4) <= fVar212) &&
                   tNear.field_0._4_4_ <= auVar109._4_4_;
          bVar30 = (fVar212 < *(float *)(uVar56 + 0xf8) && *(float *)(uVar56 + 0xe8) <= fVar212) &&
                   tNear.field_0._8_4_ <= auVar109._8_4_;
          bVar31 = (fVar212 < *(float *)(uVar56 + 0xfc) && *(float *)(uVar56 + 0xec) <= fVar212) &&
                   tNear.field_0._12_4_ <= auVar109._12_4_;
        }
        else {
          bVar28 = tNear.field_0._0_4_ <= auVar109._0_4_;
          bVar29 = tNear.field_0._4_4_ <= auVar109._4_4_;
          bVar30 = tNear.field_0._8_4_ <= auVar109._8_4_;
          bVar31 = tNear.field_0._12_4_ <= auVar109._12_4_;
        }
        auVar72._0_4_ = (uint)bVar28 * -0x80000000;
        auVar72._4_4_ = (uint)bVar29 * -0x80000000;
        auVar72._8_4_ = (uint)bVar30 * -0x80000000;
        auVar72._12_4_ = (uint)bVar31 * -0x80000000;
        uVar58 = movmskps((int)local_11d8,auVar72);
        if (uVar58 == 0) {
          if (local_13b0 == stack) {
            return;
          }
          goto LAB_0029eaae;
        }
        uVar58 = uVar58 & 0xff;
        lVar53 = 0;
        if (uVar58 != 0) {
          for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
          }
        }
        uVar21 = *(ulong *)(uVar56 + lVar53 * 8);
        uVar58 = uVar58 - 1 & uVar58;
        uVar65 = uVar21;
        if (uVar58 != 0) {
          uVar128 = tNear.field_0.i[lVar53];
          lVar53 = 0;
          if (uVar58 != 0) {
            for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
            }
          }
          uVar65 = *(ulong *)(uVar56 + lVar53 * 8);
          uVar129 = tNear.field_0.i[lVar53];
          uVar58 = uVar58 - 1 & uVar58;
          if (uVar58 == 0) {
            if (uVar128 < uVar129) {
              (local_13b0->ptr).ptr = uVar65;
              local_13b0->dist = uVar129;
              local_13b0 = local_13b0 + 1;
              uVar65 = uVar21;
            }
            else {
              (local_13b0->ptr).ptr = uVar21;
              local_13b0->dist = uVar128;
              local_13b0 = local_13b0 + 1;
            }
          }
          else {
            auVar110._8_4_ = uVar128;
            auVar110._0_8_ = uVar21;
            auVar110._12_4_ = 0;
            auVar147._8_4_ = uVar129;
            auVar147._0_8_ = uVar65;
            auVar147._12_4_ = 0;
            lVar53 = 0;
            if (uVar58 != 0) {
              for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
              }
            }
            uVar186 = *(undefined8 *)(uVar56 + lVar53 * 8);
            iVar49 = tNear.field_0.i[lVar53];
            auVar133._8_4_ = iVar49;
            auVar133._0_8_ = uVar186;
            auVar133._12_4_ = 0;
            auVar73._8_4_ = -(uint)((int)uVar128 < (int)uVar129);
            uVar58 = uVar58 - 1 & uVar58;
            if (uVar58 == 0) {
              auVar73._4_4_ = auVar73._8_4_;
              auVar73._0_4_ = auVar73._8_4_;
              auVar73._12_4_ = auVar73._8_4_;
              auVar165._8_4_ = uVar129;
              auVar165._0_8_ = uVar65;
              auVar165._12_4_ = 0;
              auVar175 = blendvps(auVar165,auVar110,auVar73);
              auVar109 = blendvps(auVar110,auVar147,auVar73);
              auVar74._8_4_ = -(uint)(auVar175._8_4_ < iVar49);
              auVar74._4_4_ = auVar74._8_4_;
              auVar74._0_4_ = auVar74._8_4_;
              auVar74._12_4_ = auVar74._8_4_;
              auVar148._8_4_ = iVar49;
              auVar148._0_8_ = uVar186;
              auVar148._12_4_ = 0;
              auVar146 = blendvps(auVar148,auVar175,auVar74);
              auVar175 = blendvps(auVar175,auVar133,auVar74);
              auVar75._8_4_ = -(uint)(auVar109._8_4_ < auVar175._8_4_);
              auVar75._4_4_ = auVar75._8_4_;
              auVar75._0_4_ = auVar75._8_4_;
              auVar75._12_4_ = auVar75._8_4_;
              SVar134 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar175,auVar109,auVar75);
              SVar111 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar109,auVar175,auVar75);
              *local_13b0 = SVar111;
              local_13b0[1] = SVar134;
              local_13b0 = local_13b0 + 2;
              uVar65 = auVar146._0_8_;
            }
            else {
              lVar53 = 0;
              if (uVar58 != 0) {
                for (; (uVar58 >> lVar53 & 1) == 0; lVar53 = lVar53 + 1) {
                }
              }
              auVar76._4_4_ = auVar73._8_4_;
              auVar76._0_4_ = auVar73._8_4_;
              auVar76._8_4_ = auVar73._8_4_;
              auVar76._12_4_ = auVar73._8_4_;
              auVar177 = blendvps(auVar147,auVar110,auVar76);
              auVar109 = blendvps(auVar110,auVar147,auVar76);
              auVar173._8_4_ = tNear.field_0.i[lVar53];
              auVar173._0_8_ = *(undefined8 *)(uVar56 + lVar53 * 8);
              auVar173._12_4_ = 0;
              auVar77._8_4_ = -(uint)(iVar49 < tNear.field_0.i[lVar53]);
              auVar77._4_4_ = auVar77._8_4_;
              auVar77._0_4_ = auVar77._8_4_;
              auVar77._12_4_ = auVar77._8_4_;
              auVar175 = blendvps(auVar173,auVar133,auVar77);
              auVar146 = blendvps(auVar133,auVar173,auVar77);
              auVar78._8_4_ = -(uint)(auVar109._8_4_ < auVar146._8_4_);
              auVar78._4_4_ = auVar78._8_4_;
              auVar78._0_4_ = auVar78._8_4_;
              auVar78._12_4_ = auVar78._8_4_;
              auVar188 = blendvps(auVar146,auVar109,auVar78);
              SVar111 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar109,auVar146,auVar78);
              auVar79._8_4_ = -(uint)(auVar177._8_4_ < auVar175._8_4_);
              auVar79._4_4_ = auVar79._8_4_;
              auVar79._0_4_ = auVar79._8_4_;
              auVar79._12_4_ = auVar79._8_4_;
              auVar109 = blendvps(auVar175,auVar177,auVar79);
              auVar146 = blendvps(auVar177,auVar175,auVar79);
              auVar80._8_4_ = -(uint)(auVar146._8_4_ < auVar188._8_4_);
              auVar80._4_4_ = auVar80._8_4_;
              auVar80._0_4_ = auVar80._8_4_;
              auVar80._12_4_ = auVar80._8_4_;
              SVar134 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar188,auVar146,auVar80);
              SVar166 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar146,auVar188,auVar80);
              *local_13b0 = SVar111;
              local_13b0[1] = SVar166;
              local_13b0[2] = SVar134;
              local_13b0 = local_13b0 + 3;
              uVar65 = auVar109._0_8_;
              fVar216 = local_1288;
              fVar183 = fStack_1284;
              fVar193 = fStack_1280;
              fVar214 = fStack_127c;
              fVar238 = local_1298;
              fVar217 = fStack_1294;
              fVar260 = fStack_1290;
              fVar108 = fStack_128c;
            }
          }
        }
      }
      local_1220 = (ulong)((uint)uVar65 & 0xf) - 8;
      if (local_1220 != 0) {
        uVar65 = uVar65 & 0xfffffffffffffff0;
        local_1218 = 0;
        do {
          lVar53 = local_1218 * 0x90;
          fVar131 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(uVar65 + 0x80 + lVar53)) *
                    *(float *)(uVar65 + 0x84 + lVar53);
          uVar56 = *(ulong *)(uVar65 + 0x20 + lVar53);
          auVar112._8_8_ = 0;
          auVar112._0_8_ = uVar56;
          uVar21 = *(ulong *)(uVar65 + 0x24 + lVar53);
          auVar149._8_8_ = 0;
          auVar149._0_8_ = uVar21;
          bVar32 = (byte)uVar21;
          bVar71 = (byte)uVar56;
          bVar33 = (byte)(uVar21 >> 8);
          bVar102 = (byte)(uVar56 >> 8);
          bVar34 = (byte)(uVar21 >> 0x10);
          bVar103 = (byte)(uVar56 >> 0x10);
          bVar35 = (byte)(uVar21 >> 0x18);
          bVar104 = (byte)(uVar56 >> 0x18);
          bVar36 = (byte)(uVar21 >> 0x20);
          bVar105 = (byte)(uVar56 >> 0x20);
          bVar37 = (byte)(uVar21 >> 0x28);
          bVar106 = (byte)(uVar56 >> 0x28);
          bVar38 = (byte)(uVar21 >> 0x30);
          bVar107 = (byte)(uVar56 >> 0x30);
          bVar43 = (byte)(uVar56 >> 0x38);
          bVar39 = (byte)(uVar21 >> 0x38);
          auVar81[0] = -((byte)((bVar32 < bVar71) * bVar32 | (bVar32 >= bVar71) * bVar71) == bVar71)
          ;
          auVar81[1] = -((byte)((bVar33 < bVar102) * bVar33 | (bVar33 >= bVar102) * bVar102) ==
                        bVar102);
          auVar81[2] = -((byte)((bVar34 < bVar103) * bVar34 | (bVar34 >= bVar103) * bVar103) ==
                        bVar103);
          auVar81[3] = -((byte)((bVar35 < bVar104) * bVar35 | (bVar35 >= bVar104) * bVar104) ==
                        bVar104);
          auVar81[4] = -((byte)((bVar36 < bVar105) * bVar36 | (bVar36 >= bVar105) * bVar105) ==
                        bVar105);
          auVar81[5] = -((byte)((bVar37 < bVar106) * bVar37 | (bVar37 >= bVar106) * bVar106) ==
                        bVar106);
          auVar81[6] = -((byte)((bVar38 < bVar107) * bVar38 | (bVar38 >= bVar107) * bVar107) ==
                        bVar107);
          auVar81[7] = -((byte)((bVar39 < bVar43) * bVar39 | (bVar39 >= bVar43) * bVar43) == bVar43)
          ;
          auVar81[8] = 0xff;
          auVar81[9] = 0xff;
          auVar81[10] = 0xff;
          auVar81[0xb] = 0xff;
          auVar81[0xc] = 0xff;
          auVar81[0xd] = 0xff;
          auVar81[0xe] = 0xff;
          auVar81[0xf] = 0xff;
          auVar109 = pmovzxbd(auVar112,auVar112);
          fVar236 = *(float *)(uVar65 + 0x38 + lVar53);
          fVar216 = *(float *)(uVar65 + 0x3c + lVar53);
          fVar238 = *(float *)(uVar65 + 0x40 + lVar53);
          fVar218 = *(float *)(uVar65 + 0x44 + lVar53);
          fVar219 = (float)auVar109._0_4_ * fVar218 + fVar236;
          fVar227 = (float)auVar109._4_4_ * fVar218 + fVar236;
          fVar231 = (float)auVar109._8_4_ * fVar218 + fVar236;
          fVar235 = (float)auVar109._12_4_ * fVar218 + fVar236;
          auVar113._8_8_ = 0;
          auVar113._0_8_ = *(ulong *)(uVar65 + 0x50 + lVar53);
          auVar109 = pmovzxbd(auVar113,auVar113);
          fVar183 = *(float *)(uVar65 + 0x74 + lVar53);
          fVar193 = *(float *)(uVar65 + 0x68 + lVar53);
          auVar146 = pmovzxbd(auVar149,auVar149);
          fVar220 = (float)auVar146._0_4_ * fVar218 + fVar236;
          fVar228 = (float)auVar146._4_4_ * fVar218 + fVar236;
          fVar232 = (float)auVar146._8_4_ * fVar218 + fVar236;
          fVar236 = (float)auVar146._12_4_ * fVar218 + fVar236;
          auVar150._8_8_ = 0;
          auVar150._0_8_ = *(ulong *)(uVar65 + 0x54 + lVar53);
          auVar146 = pmovzxbd(auVar150,auVar150);
          auVar174._8_8_ = 0;
          auVar174._0_8_ = *(ulong *)(uVar65 + 0x28 + lVar53);
          auVar175 = pmovzxbd(auVar174,auVar174);
          fVar218 = *(float *)(uVar65 + 0x48 + lVar53);
          fVar202 = (float)auVar175._0_4_ * fVar218 + fVar216;
          fVar210 = (float)auVar175._4_4_ * fVar218 + fVar216;
          fVar212 = (float)auVar175._8_4_ * fVar218 + fVar216;
          fVar215 = (float)auVar175._12_4_ * fVar218 + fVar216;
          auVar176._8_8_ = 0;
          auVar176._0_8_ = *(ulong *)(uVar65 + 0x58 + lVar53);
          auVar177 = pmovzxbd(auVar176,auVar176);
          fVar214 = *(float *)(uVar65 + 0x78 + lVar53);
          fVar217 = *(float *)(uVar65 + 0x6c + lVar53);
          auVar204._8_8_ = 0;
          auVar204._0_8_ = *(ulong *)(uVar65 + 0x2c + lVar53);
          auVar175 = pmovzxbd(auVar204,auVar204);
          fVar203 = (float)auVar175._0_4_ * fVar218 + fVar216;
          fVar211 = (float)auVar175._4_4_ * fVar218 + fVar216;
          fVar213 = (float)auVar175._8_4_ * fVar218 + fVar216;
          fVar216 = (float)auVar175._12_4_ * fVar218 + fVar216;
          auVar187._8_8_ = 0;
          auVar187._0_8_ = *(ulong *)(uVar65 + 0x5c + lVar53);
          auVar188 = pmovzxbd(auVar187,auVar187);
          auVar205._8_8_ = 0;
          auVar205._0_8_ = *(ulong *)(uVar65 + 0x30 + lVar53);
          auVar175 = pmovzxbd(auVar205,auVar205);
          fVar218 = *(float *)(uVar65 + 0x4c + lVar53);
          fVar221 = (float)auVar175._0_4_ * fVar218 + fVar238;
          fVar229 = (float)auVar175._4_4_ * fVar218 + fVar238;
          fVar233 = (float)auVar175._8_4_ * fVar218 + fVar238;
          fVar237 = (float)auVar175._12_4_ * fVar218 + fVar238;
          auVar206._8_8_ = 0;
          auVar206._0_8_ = *(ulong *)(uVar65 + 0x60 + lVar53);
          auVar207 = pmovzxbd(auVar206,auVar206);
          fVar260 = *(float *)(uVar65 + 0x7c + lVar53);
          fVar108 = *(float *)(uVar65 + 0x70 + lVar53);
          auVar223._8_8_ = 0;
          auVar223._0_8_ = *(ulong *)(uVar65 + 0x34 + lVar53);
          auVar175 = pmovzxbd(auVar223,auVar223);
          fVar222 = (float)auVar175._0_4_ * fVar218 + fVar238;
          fVar230 = (float)auVar175._4_4_ * fVar218 + fVar238;
          fVar234 = (float)auVar175._8_4_ * fVar218 + fVar238;
          fVar238 = (float)auVar175._12_4_ * fVar218 + fVar238;
          auVar167._8_8_ = 0;
          auVar167._0_8_ = *(ulong *)(uVar65 + 100 + lVar53);
          auVar175 = pmovzxbd(auVar167,auVar167);
          fVar218 = (((((float)auVar109._0_4_ * fVar183 + fVar193) - fVar219) * fVar131 + fVar219) -
                    local_11b8) * fVar267;
          fVar219 = (((((float)auVar109._4_4_ * fVar183 + fVar193) - fVar227) * fVar131 + fVar227) -
                    fStack_11b4) * fVar245;
          fVar227 = (((((float)auVar109._8_4_ * fVar183 + fVar193) - fVar231) * fVar131 + fVar231) -
                    fStack_11b0) * fVar163;
          fVar231 = (((((float)auVar109._12_4_ * fVar183 + fVar193) - fVar235) * fVar131 + fVar235)
                    - fStack_11ac) * fVar172;
          fVar235 = (((((float)auVar177._0_4_ * fVar214 + fVar217) - fVar202) * fVar131 + fVar202) -
                    local_1288) * fVar239;
          fVar181 = (((((float)auVar177._4_4_ * fVar214 + fVar217) - fVar210) * fVar131 + fVar210) -
                    fStack_1284) * fVar239;
          fVar182 = (((((float)auVar177._8_4_ * fVar214 + fVar217) - fVar212) * fVar131 + fVar212) -
                    fStack_1280) * fVar239;
          fVar215 = (((((float)auVar177._12_4_ * fVar214 + fVar217) - fVar215) * fVar131 + fVar215)
                    - fStack_127c) * fVar239;
          fVar202 = (((((float)auVar146._0_4_ * fVar183 + fVar193) - fVar220) * fVar131 + fVar220) -
                    local_11b8) * local_11c8;
          fVar210 = (((((float)auVar146._4_4_ * fVar183 + fVar193) - fVar228) * fVar131 + fVar228) -
                    fStack_11b4) * fStack_11c4;
          fVar212 = (((((float)auVar146._8_4_ * fVar183 + fVar193) - fVar232) * fVar131 + fVar232) -
                    fStack_11b0) * fStack_11c0;
          fVar236 = (((((float)auVar146._12_4_ * fVar183 + fVar193) - fVar236) * fVar131 + fVar236)
                    - fStack_11ac) * fStack_11bc;
          fVar183 = (((((float)auVar188._0_4_ * fVar214 + fVar217) - fVar203) * fVar131 + fVar203) -
                    local_1288) * fVar253;
          fVar193 = (((((float)auVar188._4_4_ * fVar214 + fVar217) - fVar211) * fVar131 + fVar211) -
                    fStack_1284) * fVar195;
          fVar203 = (((((float)auVar188._8_4_ * fVar214 + fVar217) - fVar213) * fVar131 + fVar213) -
                    fStack_1280) * fVar198;
          fVar216 = (((((float)auVar188._12_4_ * fVar214 + fVar217) - fVar216) * fVar131 + fVar216)
                    - fStack_127c) * fVar201;
          uVar132 = (uint)((int)fVar202 < (int)fVar218) * (int)fVar202 |
                    (uint)((int)fVar202 >= (int)fVar218) * (int)fVar218;
          uVar142 = (uint)((int)fVar210 < (int)fVar219) * (int)fVar210 |
                    (uint)((int)fVar210 >= (int)fVar219) * (int)fVar219;
          uVar143 = (uint)((int)fVar212 < (int)fVar227) * (int)fVar212 |
                    (uint)((int)fVar212 >= (int)fVar227) * (int)fVar227;
          uVar144 = (uint)((int)fVar236 < (int)fVar231) * (int)fVar236 |
                    (uint)((int)fVar236 >= (int)fVar231) * (int)fVar231;
          uVar145 = (uint)((int)fVar202 < (int)fVar218) * (int)fVar218 |
                    (uint)((int)fVar202 >= (int)fVar218) * (int)fVar202;
          uVar160 = (uint)((int)fVar210 < (int)fVar219) * (int)fVar219 |
                    (uint)((int)fVar210 >= (int)fVar219) * (int)fVar210;
          uVar161 = (uint)((int)fVar212 < (int)fVar227) * (int)fVar227 |
                    (uint)((int)fVar212 >= (int)fVar227) * (int)fVar212;
          uVar162 = (uint)((int)fVar236 < (int)fVar231) * (int)fVar231 |
                    (uint)((int)fVar236 >= (int)fVar231) * (int)fVar236;
          uVar58 = (uint)((int)fVar183 < (int)fVar235) * (int)fVar183 |
                   (uint)((int)fVar183 >= (int)fVar235) * (int)fVar235;
          uVar128 = (uint)((int)fVar193 < (int)fVar181) * (int)fVar193 |
                    (uint)((int)fVar193 >= (int)fVar181) * (int)fVar181;
          uVar129 = (uint)((int)fVar203 < (int)fVar182) * (int)fVar203 |
                    (uint)((int)fVar203 >= (int)fVar182) * (int)fVar182;
          uVar130 = (uint)((int)fVar216 < (int)fVar215) * (int)fVar216 |
                    (uint)((int)fVar216 >= (int)fVar215) * (int)fVar215;
          uVar58 = ((int)uVar58 < (int)uVar132) * uVar132 | ((int)uVar58 >= (int)uVar132) * uVar58;
          uVar128 = ((int)uVar128 < (int)uVar142) * uVar142 |
                    ((int)uVar128 >= (int)uVar142) * uVar128;
          uVar129 = ((int)uVar129 < (int)uVar143) * uVar143 |
                    ((int)uVar129 >= (int)uVar143) * uVar129;
          uVar130 = ((int)uVar130 < (int)uVar144) * uVar144 |
                    ((int)uVar130 >= (int)uVar144) * uVar130;
          uVar132 = (uint)((int)fVar183 < (int)fVar235) * (int)fVar235 |
                    (uint)((int)fVar183 >= (int)fVar235) * (int)fVar183;
          uVar142 = (uint)((int)fVar193 < (int)fVar181) * (int)fVar181 |
                    (uint)((int)fVar193 >= (int)fVar181) * (int)fVar193;
          uVar143 = (uint)((int)fVar203 < (int)fVar182) * (int)fVar182 |
                    (uint)((int)fVar203 >= (int)fVar182) * (int)fVar203;
          uVar144 = (uint)((int)fVar216 < (int)fVar215) * (int)fVar215 |
                    (uint)((int)fVar216 >= (int)fVar215) * (int)fVar216;
          fVar183 = (((((float)auVar207._0_4_ * fVar260 + fVar108) - fVar221) * fVar131 + fVar221) -
                    local_1298) * fVar266;
          fVar193 = (((((float)auVar207._4_4_ * fVar260 + fVar108) - fVar229) * fVar131 + fVar229) -
                    fStack_1294) * fVar263;
          fVar214 = (((((float)auVar207._8_4_ * fVar260 + fVar108) - fVar233) * fVar131 + fVar233) -
                    fStack_1290) * fVar240;
          fVar217 = (((((float)auVar207._12_4_ * fVar260 + fVar108) - fVar237) * fVar131 + fVar237)
                    - fStack_128c) * fVar244;
          fVar236 = (((((float)auVar175._0_4_ * fVar260 + fVar108) - fVar222) * fVar131 + fVar222) -
                    local_1298) * fVar256;
          fVar216 = (((((float)auVar175._4_4_ * fVar260 + fVar108) - fVar230) * fVar131 + fVar230) -
                    fStack_1294) * fVar185;
          fVar218 = (((((float)auVar175._8_4_ * fVar260 + fVar108) - fVar234) * fVar131 + fVar234) -
                    fStack_1290) * fVar196;
          fVar238 = (((((float)auVar175._12_4_ * fVar260 + fVar108) - fVar238) * fVar131 + fVar238)
                    - fStack_128c) * fVar199;
          uVar184 = ((int)uVar145 < (int)uVar132) * uVar145 |
                    ((int)uVar145 >= (int)uVar132) * uVar132;
          uVar194 = ((int)uVar160 < (int)uVar142) * uVar160 |
                    ((int)uVar160 >= (int)uVar142) * uVar142;
          uVar197 = ((int)uVar161 < (int)uVar143) * uVar161 |
                    ((int)uVar161 >= (int)uVar143) * uVar143;
          uVar200 = ((int)uVar162 < (int)uVar144) * uVar162 |
                    ((int)uVar162 >= (int)uVar144) * uVar144;
          uVar132 = (uint)((int)fVar236 < (int)fVar183) * (int)fVar236 |
                    (uint)((int)fVar236 >= (int)fVar183) * (int)fVar183;
          uVar142 = (uint)((int)fVar216 < (int)fVar193) * (int)fVar216 |
                    (uint)((int)fVar216 >= (int)fVar193) * (int)fVar193;
          uVar143 = (uint)((int)fVar218 < (int)fVar214) * (int)fVar218 |
                    (uint)((int)fVar218 >= (int)fVar214) * (int)fVar214;
          uVar144 = (uint)((int)fVar238 < (int)fVar217) * (int)fVar238 |
                    (uint)((int)fVar238 >= (int)fVar217) * (int)fVar217;
          uVar145 = (uint)((int)fVar236 < (int)fVar183) * (int)fVar183 |
                    (uint)((int)fVar236 >= (int)fVar183) * (int)fVar236;
          uVar160 = (uint)((int)fVar216 < (int)fVar193) * (int)fVar193 |
                    (uint)((int)fVar216 >= (int)fVar193) * (int)fVar216;
          uVar161 = (uint)((int)fVar218 < (int)fVar214) * (int)fVar214 |
                    (uint)((int)fVar218 >= (int)fVar214) * (int)fVar218;
          uVar162 = (uint)((int)fVar238 < (int)fVar217) * (int)fVar217 |
                    (uint)((int)fVar238 >= (int)fVar217) * (int)fVar238;
          iVar49 = bi_2.field_0._0_4_;
          uVar132 = (uint)((int)uVar132 < iVar49) * iVar49 | ((int)uVar132 >= iVar49) * uVar132;
          iVar49 = bi_2.field_0._4_4_;
          uVar142 = (uint)((int)uVar142 < iVar49) * iVar49 | ((int)uVar142 >= iVar49) * uVar142;
          iVar49 = bi_2.field_0._8_4_;
          uVar143 = (uint)((int)uVar143 < iVar49) * iVar49 | ((int)uVar143 >= iVar49) * uVar143;
          iVar49 = bi_2.field_0._12_4_;
          uVar144 = (uint)((int)uVar144 < iVar49) * iVar49 | ((int)uVar144 >= iVar49) * uVar144;
          dist.field_0.i[0] =
               ((int)uVar132 < (int)uVar58) * uVar58 | ((int)uVar132 >= (int)uVar58) * uVar132;
          dist.field_0.i[1] =
               ((int)uVar142 < (int)uVar128) * uVar128 | ((int)uVar142 >= (int)uVar128) * uVar142;
          dist.field_0.i[2] =
               ((int)uVar143 < (int)uVar129) * uVar129 | ((int)uVar143 >= (int)uVar129) * uVar143;
          dist.field_0.i[3] =
               ((int)uVar144 < (int)uVar130) * uVar130 | ((int)uVar144 >= (int)uVar130) * uVar144;
          uVar58 = (uint)((int)local_1238 < (int)uVar145) * (int)local_1238 |
                   ((int)local_1238 >= (int)uVar145) * uVar145;
          uVar128 = (uint)((int)fStack_1234 < (int)uVar160) * (int)fStack_1234 |
                    ((int)fStack_1234 >= (int)uVar160) * uVar160;
          uVar129 = (uint)((int)fStack_1230 < (int)uVar161) * (int)fStack_1230 |
                    ((int)fStack_1230 >= (int)uVar161) * uVar161;
          uVar130 = (uint)((int)fStack_122c < (int)uVar162) * (int)fStack_122c |
                    ((int)fStack_122c >= (int)uVar162) * uVar162;
          auVar135._0_4_ =
               -(uint)((int)(((int)uVar184 < (int)uVar58) * uVar184 |
                            ((int)uVar184 >= (int)uVar58) * uVar58) < dist.field_0.i[0]);
          auVar135._4_4_ =
               -(uint)((int)(((int)uVar194 < (int)uVar128) * uVar194 |
                            ((int)uVar194 >= (int)uVar128) * uVar128) < dist.field_0.i[1]);
          auVar135._8_4_ =
               -(uint)((int)(((int)uVar197 < (int)uVar129) * uVar197 |
                            ((int)uVar197 >= (int)uVar129) * uVar129) < dist.field_0.i[2]);
          auVar135._12_4_ =
               -(uint)((int)(((int)uVar200 < (int)uVar130) * uVar200 |
                            ((int)uVar200 >= (int)uVar130) * uVar130) < dist.field_0.i[3]);
          auVar109 = pmovsxbd(auVar81,auVar81);
          uVar58 = movmskps((int)lVar53,~auVar135 & auVar109);
          aVar246 = bi_2.field_0;
          if (uVar58 != 0) {
            lVar53 = lVar53 + uVar65;
            local_11e0 = (ulong)(uVar58 & 0xff);
            do {
              pRVar48 = local_11f0;
              sVar47 = local_11f8;
              lVar66 = 0;
              if (local_11e0 != 0) {
                for (; (local_11e0 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                }
              }
              fVar236 = *(float *)(ray + k * 4 + 0x80);
              if (dist.field_0.v[lVar66] <= fVar236) {
                local_1278 = ZEXT416((uint)fVar236);
                uVar19 = *(ushort *)(lVar53 + lVar66 * 8);
                uVar20 = *(ushort *)(lVar53 + 2 + lVar66 * 8);
                uVar58 = *(uint *)(lVar53 + 0x88);
                uVar56 = (ulong)uVar58;
                uVar128 = *(uint *)(lVar53 + 4 + lVar66 * 8);
                local_1410 = (ulong)uVar128;
                local_11e8 = context->scene;
                pGVar22 = (local_11e8->geometries).items[uVar56].ptr;
                lVar23 = *(long *)&pGVar22->field_0x58;
                lVar61 = local_1410 *
                         pGVar22[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i;
                fVar216 = pGVar22->fnumTimeSegments;
                fVar238 = (pGVar22->time_range).lower;
                auVar136._0_4_ = (pGVar22->time_range).upper - fVar238;
                auVar114._4_4_ = fVar238;
                auVar114._0_4_ = fVar238;
                auVar114._8_4_ = fVar238;
                auVar114._12_4_ = fVar238;
                auVar168._0_4_ = *(float *)(ray + 0x70) - fVar238;
                auVar168._4_4_ = *(float *)(ray + 0x74) - fVar238;
                auVar168._8_4_ = *(float *)(ray + 0x78) - fVar238;
                auVar168._12_4_ = *(float *)(ray + 0x7c) - fVar238;
                auVar136._4_4_ = auVar136._0_4_;
                auVar136._8_4_ = auVar136._0_4_;
                auVar136._12_4_ = auVar136._0_4_;
                auVar109 = divps(auVar168,auVar136);
                auVar169._0_4_ = auVar109._0_4_ * fVar216;
                auVar169._4_4_ = auVar109._4_4_ * fVar216;
                auVar169._8_4_ = auVar109._8_4_ * fVar216;
                auVar169._12_4_ = auVar109._12_4_ * fVar216;
                auVar109 = roundps(auVar114,auVar169,1);
                auVar82._0_4_ = fVar216 + -1.0;
                auVar82._4_4_ = auVar82._0_4_;
                auVar82._8_4_ = auVar82._0_4_;
                auVar82._12_4_ = auVar82._0_4_;
                auVar109 = minps(auVar109,auVar82);
                auVar109 = maxps(auVar109,_DAT_01f7aa10);
                ftime.field_0.v[0] = auVar169._0_4_ - auVar109._0_4_;
                ftime.field_0.v[1] = auVar169._4_4_ - auVar109._4_4_;
                ftime.field_0.v[2] = auVar169._8_4_ - auVar109._8_4_;
                ftime.field_0.v[3] = auVar169._12_4_ - auVar109._12_4_;
                itime.field_0.i[0] = (int)auVar109._0_4_;
                itime.field_0.i[1] = (int)auVar109._4_4_;
                itime.field_0.i[2] = (int)auVar109._8_4_;
                itime.field_0.i[3] = (int)auVar109._12_4_;
                uVar130 = uVar19 & 0x7fff;
                uVar132 = uVar20 & 0x7fff;
                uVar129 = *(uint *)(lVar23 + 4 + lVar61);
                uVar67 = (ulong)uVar129;
                uVar64 = (ulong)(uVar129 * uVar132 + *(int *)(lVar23 + lVar61) + uVar130);
                lVar24 = *(long *)&pGVar22[2].numPrimitives;
                lVar63 = (long)itime.field_0.i[k] * 0x38;
                lVar25 = *(long *)(lVar24 + 0x10 + lVar63);
                lVar26 = *(long *)(lVar24 + lVar63);
                pfVar14 = (float *)(lVar26 + lVar25 * uVar64);
                lVar27 = *(long *)(lVar24 + 0x48 + lVar63);
                pfVar15 = (float *)(lVar26 + (uVar64 + 1) * lVar25);
                lVar66 = uVar64 + uVar67;
                pfVar1 = (float *)(lVar26 + lVar66 * lVar25);
                lVar59 = uVar64 + uVar67 + 1;
                pfVar2 = (float *)(lVar26 + lVar59 * lVar25);
                uVar62 = (ulong)(-1 < (short)uVar19);
                lVar54 = uVar64 + uVar62 + 1;
                pfVar3 = (float *)(lVar26 + lVar54 * lVar25);
                lVar57 = uVar62 + lVar59;
                pfVar4 = (float *)(lVar26 + lVar57 * lVar25);
                uVar62 = 0;
                if (-1 < (short)uVar20) {
                  uVar62 = uVar67;
                }
                pfVar5 = (float *)(lVar26 + (lVar66 + uVar62) * lVar25);
                pfVar6 = (float *)(lVar26 + (lVar59 + uVar62) * lVar25);
                lVar26 = lVar26 + lVar25 * (uVar62 + lVar57);
                fVar256 = *(float *)(lVar26 + 4);
                fVar238 = *(float *)(lVar26 + 8);
                lVar26 = *(long *)(lVar24 + 0x38 + lVar63);
                pfVar7 = (float *)(lVar26 + lVar27 * uVar64);
                pfVar8 = (float *)(lVar26 + lVar27 * (uVar64 + 1));
                pfVar9 = (float *)(lVar26 + lVar27 * lVar66);
                pfVar10 = (float *)(lVar26 + lVar27 * lVar59);
                pfVar11 = (float *)(lVar26 + lVar27 * lVar54);
                pfVar12 = (float *)(lVar26 + lVar27 * lVar57);
                fVar216 = *(float *)((long)&stack[-1].ptr.ptr + local_11f8 * 4);
                pfVar13 = (float *)(lVar26 + lVar27 * (lVar66 + uVar62));
                fVar210 = (*pfVar8 - *pfVar15) * fVar216 + *pfVar15;
                local_1088 = (pfVar8[1] - pfVar15[1]) * fVar216 + pfVar15[1];
                local_1078 = (pfVar8[2] - pfVar15[2]) * fVar216 + pfVar15[2];
                pfVar15 = (float *)(lVar26 + lVar27 * (lVar59 + uVar62));
                fVar193 = (*pfVar9 - *pfVar1) * fVar216 + *pfVar1;
                local_1098 = (pfVar9[1] - pfVar1[1]) * fVar216 + pfVar1[1];
                fVar214 = (pfVar9[2] - pfVar1[2]) * fVar216 + pfVar1[2];
                lVar26 = lVar26 + (uVar62 + lVar57) * lVar27;
                fVar183 = *(float *)(lVar26 + 4);
                fVar227 = (*pfVar10 - *pfVar2) * fVar216 + *pfVar2;
                fVar231 = (pfVar10[1] - pfVar2[1]) * fVar216 + pfVar2[1];
                fStack_106c = (pfVar10[2] - pfVar2[2]) * fVar216 + pfVar2[2];
                fStack_1084 = (pfVar11[1] - pfVar3[1]) * fVar216 + pfVar3[1];
                fStack_1074 = (pfVar11[2] - pfVar3[2]) * fVar216 + pfVar3[2];
                fVar181 = (*pfVar12 - *pfVar4) * fVar216 + *pfVar4;
                fVar212 = (pfVar12[1] - pfVar4[1]) * fVar216 + pfVar4[1];
                fStack_1070 = (pfVar12[2] - pfVar4[2]) * fVar216 + pfVar4[2];
                fStack_1254 = (*pfVar13 - *pfVar5) * fVar216 + *pfVar5;
                fStack_108c = (pfVar13[1] - pfVar5[1]) * fVar216 + pfVar5[1];
                fStack_1054 = (pfVar13[2] - pfVar5[2]) * fVar216 + pfVar5[2];
                local_1258 = (*pfVar15 - *pfVar6) * fVar216 + *pfVar6;
                fVar219 = (pfVar15[1] - pfVar6[1]) * fVar216 + pfVar6[1];
                fStack_1234 = (pfVar15[2] - pfVar6[2]) * fVar216 + pfVar6[2];
                local_1238 = (*(float *)(lVar26 + 8) - fVar238) * fVar216 + fVar238;
                fVar238 = *(float *)(local_11f0 + local_11f8 * 4);
                fVar218 = *(float *)(local_11f0 + local_11f8 * 4 + 0x10);
                local_fb8 = ((*pfVar7 - *pfVar14) * fVar216 + *pfVar14) - fVar238;
                fStack_fb4 = fVar210 - fVar238;
                fStack_fb0 = fVar227 - fVar238;
                fStack_fac = fVar193 - fVar238;
                local_1248 = fVar181;
                fStack_1244 = fVar227;
                fVar210 = fVar210 - fVar238;
                fVar195 = ((*pfVar11 - *pfVar3) * fVar216 + *pfVar3) - fVar238;
                fVar198 = fVar181 - fVar238;
                fVar201 = fVar227 - fVar238;
                local_1268 = CONCAT44(fVar227,fVar193);
                fVar193 = fVar193 - fVar238;
                fVar217 = fVar227 - fVar238;
                fVar108 = local_1258 - fVar238;
                fVar238 = fStack_1254 - fVar238;
                fVar253 = *(float *)(local_11f0 + local_11f8 * 4 + 0x20);
                local_fc8 = ((pfVar7[1] - pfVar14[1]) * fVar216 + pfVar14[1]) - fVar218;
                fStack_fc4 = local_1088 - fVar218;
                fStack_fc0 = fVar231 - fVar218;
                fStack_fbc = local_1098 - fVar218;
                local_ff8 = ((pfVar7[2] - pfVar14[2]) * fVar216 + pfVar14[2]) - fVar253;
                fStack_ff4 = local_1078 - fVar253;
                fStack_ff0 = fStack_106c - fVar253;
                fStack_fec = fVar214 - fVar253;
                fStack_1094 = fVar231;
                fStack_1090 = fVar219;
                local_1448 = local_1098 - fVar218;
                fStack_1444 = fVar231 - fVar218;
                fStack_1440 = fVar219 - fVar218;
                fStack_143c = fStack_108c - fVar218;
                local_1068 = CONCAT44(fStack_106c,fVar214);
                local_1058 = fStack_1234;
                fVar214 = fVar214 - fVar253;
                fVar260 = fStack_106c - fVar253;
                fVar266 = fStack_1234 - fVar253;
                fVar263 = fStack_1054 - fVar253;
                local_fd8 = fVar193 - local_fb8;
                fStack_fd4 = fVar217 - fStack_fb4;
                fStack_fd0 = fVar108 - fStack_fb0;
                fStack_fcc = fVar238 - fStack_fac;
                local_1008 = local_1448 - local_fc8;
                fStack_1004 = fStack_1444 - fStack_fc4;
                fStack_1000 = fStack_1440 - fStack_fc0;
                fStack_ffc = fStack_143c - fStack_fbc;
                local_fe8 = fVar214 - local_ff8;
                fStack_fe4 = fVar260 - fStack_ff4;
                fStack_fe0 = fVar266 - fStack_ff0;
                fStack_fdc = fVar263 - fStack_fec;
                local_14c8._4_4_ = *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0x50);
                local_14c8._0_4_ = local_14c8._4_4_;
                fStack_14c0 = (float)local_14c8._4_4_;
                fStack_14bc = (float)local_14c8._4_4_;
                local_14d8._4_4_ = *(float *)(local_11f0 + local_11f8 * 4 + 0x60);
                fStack_146c = *(float *)(local_11f0 + local_11f8 * 4 + 0x40);
                fVar185 = (local_1008 * (fVar214 + local_ff8) - (local_1448 + local_fc8) * local_fe8
                          ) * fStack_146c +
                          ((fVar193 + local_fb8) * local_fe8 - (fVar214 + local_ff8) * local_fd8) *
                          (float)local_14c8._4_4_ +
                          (local_fd8 * (local_1448 + local_fc8) - (fVar193 + local_fb8) * local_1008
                          ) * local_14d8._4_4_;
                fVar196 = (fStack_1004 * (fVar260 + fStack_ff4) -
                          (fStack_1444 + fStack_fc4) * fStack_fe4) * fStack_146c +
                          ((fVar217 + fStack_fb4) * fStack_fe4 - (fVar260 + fStack_ff4) * fStack_fd4
                          ) * (float)local_14c8._4_4_ +
                          (fStack_fd4 * (fStack_1444 + fStack_fc4) -
                          (fVar217 + fStack_fb4) * fStack_1004) * local_14d8._4_4_;
                uVar186 = CONCAT44(fVar196,fVar185);
                fVar199 = (fStack_1000 * (fVar266 + fStack_ff0) -
                          (fStack_1440 + fStack_fc0) * fStack_fe0) * fStack_146c +
                          ((fVar108 + fStack_fb0) * fStack_fe0 - (fVar266 + fStack_ff0) * fStack_fd0
                          ) * (float)local_14c8._4_4_ +
                          (fStack_fd0 * (fStack_1440 + fStack_fc0) -
                          (fVar108 + fStack_fb0) * fStack_1000) * local_14d8._4_4_;
                fVar235 = (fStack_ffc * (fVar263 + fStack_fec) -
                          (fStack_143c + fStack_fbc) * fStack_fdc) * fStack_146c +
                          ((fVar238 + fStack_fac) * fStack_fdc - (fVar263 + fStack_fec) * fStack_fcc
                          ) * (float)local_14c8._4_4_ +
                          (fStack_fcc * (fStack_143c + fStack_fbc) -
                          (fVar238 + fStack_fac) * fStack_ffc) * local_14d8._4_4_;
                fStack_1080 = fVar212;
                fStack_107c = fVar231;
                fVar240 = local_1088 - fVar218;
                fVar244 = fStack_1084 - fVar218;
                fVar267 = fVar212 - fVar218;
                fVar245 = fVar231 - fVar218;
                fVar228 = local_1078 - fVar253;
                fVar229 = fStack_1074 - fVar253;
                fVar230 = fStack_1070 - fVar253;
                fVar232 = fStack_106c - fVar253;
                fVar213 = local_fb8 - fVar210;
                fVar220 = fStack_fb4 - fVar195;
                fVar221 = fStack_fb0 - fVar198;
                fVar222 = fStack_fac - fVar201;
                fVar233 = local_fc8 - fVar240;
                fVar234 = fStack_fc4 - fVar244;
                fVar237 = fStack_fc0 - fVar267;
                fVar264 = fStack_fbc - fVar245;
                local_1018 = local_ff8 - fVar228;
                fStack_1014 = fStack_ff4 - fVar229;
                fStack_1010 = fStack_ff0 - fVar230;
                fStack_100c = fStack_fec - fVar232;
                auVar254._0_4_ =
                     (fVar233 * (local_ff8 + fVar228) - (local_fc8 + fVar240) * local_1018) *
                     fStack_146c +
                     ((local_fb8 + fVar210) * local_1018 - (local_ff8 + fVar228) * fVar213) *
                     (float)local_14c8._4_4_ +
                     (fVar213 * (local_fc8 + fVar240) - (local_fb8 + fVar210) * fVar233) *
                     local_14d8._4_4_;
                auVar254._4_4_ =
                     (fVar234 * (fStack_ff4 + fVar229) - (fStack_fc4 + fVar244) * fStack_1014) *
                     fStack_146c +
                     ((fStack_fb4 + fVar195) * fStack_1014 - (fStack_ff4 + fVar229) * fVar220) *
                     (float)local_14c8._4_4_ +
                     (fVar220 * (fStack_fc4 + fVar244) - (fStack_fb4 + fVar195) * fVar234) *
                     local_14d8._4_4_;
                auVar254._8_4_ =
                     (fVar237 * (fStack_ff0 + fVar230) - (fStack_fc0 + fVar267) * fStack_1010) *
                     fStack_146c +
                     ((fStack_fb0 + fVar198) * fStack_1010 - (fStack_ff0 + fVar230) * fVar221) *
                     (float)local_14c8._4_4_ +
                     (fVar221 * (fStack_fc0 + fVar267) - (fStack_fb0 + fVar198) * fVar237) *
                     local_14d8._4_4_;
                auVar254._12_4_ =
                     (fVar264 * (fStack_fec + fVar232) - (fStack_fbc + fVar245) * fStack_100c) *
                     fStack_146c +
                     ((fStack_fac + fVar201) * fStack_100c - (fStack_fec + fVar232) * fVar222) *
                     (float)local_14c8._4_4_ +
                     (fVar222 * (fStack_fbc + fVar245) - (fStack_fac + fVar201) * fVar264) *
                     local_14d8._4_4_;
                fVar182 = fVar210 - fVar193;
                fVar215 = fVar195 - fVar217;
                fVar203 = fVar198 - fVar108;
                fVar211 = fVar201 - fVar238;
                fVar268 = fVar240 - local_1448;
                fVar270 = fVar244 - fStack_1444;
                fVar272 = fVar267 - fStack_1440;
                fVar274 = fVar245 - fStack_143c;
                fVar163 = fVar228 - fVar214;
                fVar172 = fVar229 - fVar260;
                fVar131 = fVar230 - fVar266;
                fVar202 = fVar232 - fVar263;
                local_1388 = fVar240 + local_1448;
                fStack_1384 = fVar244 + fStack_1444;
                fStack_1380 = fVar267 + fStack_1440;
                fStack_137c = fVar245 + fStack_143c;
                local_1378 = fVar228 + fVar214;
                fStack_1374 = fVar229 + fVar260;
                fStack_1370 = fVar230 + fVar266;
                fStack_136c = fVar232 + fVar263;
                local_14d8._0_4_ = local_14d8._4_4_;
                uStack_14d0._0_4_ = local_14d8._4_4_;
                uStack_14d0._4_4_ = local_14d8._4_4_;
                auVar115._0_4_ =
                     (fVar268 * local_1378 - local_1388 * fVar163) * fStack_146c +
                     ((fVar193 + fVar210) * fVar163 - fVar182 * local_1378) *
                     (float)local_14c8._4_4_ +
                     (fVar182 * local_1388 - (fVar193 + fVar210) * fVar268) * local_14d8._4_4_;
                auVar115._4_4_ =
                     (fVar270 * fStack_1374 - fStack_1384 * fVar172) * fStack_146c +
                     ((fVar217 + fVar195) * fVar172 - fVar215 * fStack_1374) *
                     (float)local_14c8._4_4_ +
                     (fVar215 * fStack_1384 - (fVar217 + fVar195) * fVar270) * local_14d8._4_4_;
                auVar115._8_4_ =
                     (fVar272 * fStack_1370 - fStack_1380 * fVar131) * fStack_146c +
                     ((fVar108 + fVar198) * fVar131 - fVar203 * fStack_1370) *
                     (float)local_14c8._4_4_ +
                     (fVar203 * fStack_1380 - (fVar108 + fVar198) * fVar272) * local_14d8._4_4_;
                auVar115._12_4_ =
                     (fVar274 * fStack_136c - fStack_137c * fVar202) * fStack_146c +
                     ((fVar238 + fVar201) * fVar202 - fVar211 * fStack_136c) *
                     (float)local_14c8._4_4_ +
                     (fVar211 * fStack_137c - (fVar238 + fVar201) * fVar274) * local_14d8._4_4_;
                fVar210 = fVar185 + auVar254._0_4_ + auVar115._0_4_;
                fVar195 = fVar196 + auVar254._4_4_ + auVar115._4_4_;
                fVar198 = fVar199 + auVar254._8_4_ + auVar115._8_4_;
                fVar201 = fVar235 + auVar254._12_4_ + auVar115._12_4_;
                auVar83._8_4_ = fVar199;
                auVar83._0_8_ = uVar186;
                auVar83._12_4_ = fVar235;
                auVar109 = minps(auVar83,auVar254);
                auVar109 = minps(auVar109,auVar115);
                local_1038._8_4_ = fVar199;
                local_1038._0_8_ = uVar186;
                local_1038._12_4_ = fVar235;
                auVar247._8_4_ = fVar199;
                auVar247._0_8_ = uVar186;
                auVar247._12_4_ = fVar235;
                auVar146 = maxps(auVar247,auVar254);
                auVar146 = maxps(auVar146,auVar115);
                fVar238 = ABS(fVar210);
                fVar193 = ABS(fVar195);
                fVar217 = ABS(fVar198);
                fVar108 = ABS(fVar201);
                auVar248._4_4_ = -(uint)(auVar146._4_4_ <= fVar193 * 1.1920929e-07);
                auVar248._0_4_ = -(uint)(auVar146._0_4_ <= fVar238 * 1.1920929e-07);
                auVar248._8_4_ = -(uint)(auVar146._8_4_ <= fVar217 * 1.1920929e-07);
                auVar248._12_4_ = -(uint)(auVar146._12_4_ <= fVar108 * 1.1920929e-07);
                auVar84._4_4_ = -(uint)(-(fVar193 * 1.1920929e-07) <= auVar109._4_4_);
                auVar84._0_4_ = -(uint)(-(fVar238 * 1.1920929e-07) <= auVar109._0_4_);
                auVar84._8_4_ = -(uint)(-(fVar217 * 1.1920929e-07) <= auVar109._8_4_);
                auVar84._12_4_ = -(uint)(-(fVar108 * 1.1920929e-07) <= auVar109._12_4_);
                auVar248 = auVar248 | auVar84;
                iVar49 = movmskps((int)(lVar27 * lVar57),auVar248);
                local_1198 = ZEXT416(uVar58);
                local_11a8 = ZEXT416(uVar128);
                local_1418 = uVar56;
                if (iVar49 == 0) {
                  uVar129 = 0;
                }
                else {
                  local_1048 = fVar210;
                  fStack_1044 = fVar195;
                  fStack_1040 = fVar198;
                  fStack_103c = fVar201;
                  local_1058 = fVar238;
                  fStack_1054 = fVar193;
                  fStack_1050 = fVar217;
                  fStack_104c = fVar108;
                  local_1028 = fVar268;
                  fStack_1024 = fVar270;
                  fStack_1020 = fVar272;
                  fStack_101c = fVar274;
                  auVar258._0_4_ = fVar233 * fVar163 - fVar268 * local_1018;
                  auVar258._4_4_ = fVar234 * fVar172 - fVar270 * fStack_1014;
                  auVar258._8_4_ = fVar237 * fVar131 - fVar272 * fStack_1010;
                  auVar258._12_4_ = fVar264 * fVar202 - fVar274 * fStack_100c;
                  auVar85._4_4_ = -(uint)(ABS(fVar234 * fStack_fe4) < ABS(fVar270 * fStack_1014));
                  auVar85._0_4_ = -(uint)(ABS(fVar233 * local_fe8) < ABS(fVar268 * local_1018));
                  auVar85._8_4_ = -(uint)(ABS(fVar237 * fStack_fe0) < ABS(fVar272 * fStack_1010));
                  auVar85._12_4_ = -(uint)(ABS(fVar264 * fStack_fdc) < ABS(fVar274 * fStack_100c));
                  auVar40._4_4_ = fStack_1004 * fStack_1014 - fVar234 * fStack_fe4;
                  auVar40._0_4_ = local_1008 * local_1018 - fVar233 * local_fe8;
                  auVar40._8_4_ = fStack_1000 * fStack_1010 - fVar237 * fStack_fe0;
                  auVar40._12_4_ = fStack_ffc * fStack_100c - fVar264 * fStack_fdc;
                  local_12c8 = blendvps(auVar258,auVar40,auVar85);
                  auVar208._0_4_ = fVar182 * local_1018 - fVar213 * fVar163;
                  auVar208._4_4_ = fVar215 * fStack_1014 - fVar220 * fVar172;
                  auVar208._8_4_ = fVar203 * fStack_1010 - fVar221 * fVar131;
                  auVar208._12_4_ = fVar211 * fStack_100c - fVar222 * fVar202;
                  auVar86._4_4_ = -(uint)(ABS(fStack_fd4 * fStack_1014) < ABS(fVar220 * fVar172));
                  auVar86._0_4_ = -(uint)(ABS(local_fd8 * local_1018) < ABS(fVar213 * fVar163));
                  auVar86._8_4_ = -(uint)(ABS(fStack_fd0 * fStack_1010) < ABS(fVar221 * fVar131));
                  auVar86._12_4_ = -(uint)(ABS(fStack_fcc * fStack_100c) < ABS(fVar222 * fVar202));
                  auVar41._4_4_ = fStack_fe4 * fVar220 - fStack_fd4 * fStack_1014;
                  auVar41._0_4_ = local_fe8 * fVar213 - local_fd8 * local_1018;
                  auVar41._8_4_ = fStack_fe0 * fVar221 - fStack_fd0 * fStack_1010;
                  auVar41._12_4_ = fStack_fdc * fVar222 - fStack_fcc * fStack_100c;
                  local_12b8 = blendvps(auVar208,auVar41,auVar86);
                  auVar189._0_4_ = local_fd8 * fVar233 - fVar213 * local_1008;
                  auVar189._4_4_ = fStack_fd4 * fVar234 - fVar220 * fStack_1004;
                  auVar189._8_4_ = fStack_fd0 * fVar237 - fVar221 * fStack_1000;
                  auVar189._12_4_ = fStack_fcc * fVar264 - fVar222 * fStack_ffc;
                  auVar224._0_4_ = fVar213 * fVar268 - fVar182 * fVar233;
                  auVar224._4_4_ = fVar220 * fVar270 - fVar215 * fVar234;
                  auVar224._8_4_ = fVar221 * fVar272 - fVar203 * fVar237;
                  auVar224._12_4_ = fVar222 * fVar274 - fVar211 * fVar264;
                  auVar87._4_4_ = -(uint)(ABS(fVar220 * fStack_1004) < ABS(fVar215 * fVar234));
                  auVar87._0_4_ = -(uint)(ABS(fVar213 * local_1008) < ABS(fVar182 * fVar233));
                  auVar87._8_4_ = -(uint)(ABS(fVar221 * fStack_1000) < ABS(fVar203 * fVar237));
                  auVar87._12_4_ = -(uint)(ABS(fVar222 * fStack_ffc) < ABS(fVar211 * fVar264));
                  local_12a8 = blendvps(auVar224,auVar189,auVar87);
                  fVar213 = local_12b8._4_4_;
                  fVar220 = local_12b8._8_4_;
                  fVar221 = local_12b8._12_4_;
                  fVar163 = fStack_146c * local_12c8._0_4_ +
                            (float)local_14c8._4_4_ * local_12b8._0_4_ +
                            local_14d8._4_4_ * local_12a8._0_4_;
                  fVar172 = fStack_146c * local_12c8._4_4_ +
                            (float)local_14c8._4_4_ * fVar213 + local_14d8._4_4_ * local_12a8._4_4_;
                  fVar131 = fStack_146c * local_12c8._8_4_ +
                            (float)local_14c8._4_4_ * fVar220 + local_14d8._4_4_ * local_12a8._8_4_;
                  fVar202 = fStack_146c * local_12c8._12_4_ +
                            (float)local_14c8._4_4_ * fVar221 + local_14d8._4_4_ * local_12a8._12_4_
                  ;
                  auVar137._0_4_ = fVar163 + fVar163;
                  auVar137._4_4_ = fVar172 + fVar172;
                  auVar137._8_4_ = fVar131 + fVar131;
                  auVar137._12_4_ = fVar202 + fVar202;
                  auVar88._0_4_ = local_fc8 * local_12b8._0_4_ + local_ff8 * local_12a8._0_4_;
                  auVar88._4_4_ = fStack_fc4 * fVar213 + fStack_ff4 * local_12a8._4_4_;
                  auVar88._8_4_ = fStack_fc0 * fVar220 + fStack_ff0 * local_12a8._8_4_;
                  auVar88._12_4_ = fStack_fbc * fVar221 + fStack_fec * local_12a8._12_4_;
                  fVar182 = local_fb8 * local_12c8._0_4_ + auVar88._0_4_;
                  fVar215 = fStack_fb4 * local_12c8._4_4_ + auVar88._4_4_;
                  fVar203 = fStack_fb0 * local_12c8._8_4_ + auVar88._8_4_;
                  fVar211 = fStack_fac * local_12c8._12_4_ + auVar88._12_4_;
                  auVar109 = rcpps(auVar88,auVar137);
                  fVar163 = auVar109._0_4_;
                  fVar172 = auVar109._4_4_;
                  fVar131 = auVar109._8_4_;
                  fVar202 = auVar109._12_4_;
                  auVar116._0_4_ =
                       ((1.0 - auVar137._0_4_ * fVar163) * fVar163 + fVar163) * (fVar182 + fVar182);
                  auVar116._4_4_ =
                       ((1.0 - auVar137._4_4_ * fVar172) * fVar172 + fVar172) * (fVar215 + fVar215);
                  auVar116._8_4_ =
                       ((1.0 - auVar137._8_4_ * fVar131) * fVar131 + fVar131) * (fVar203 + fVar203);
                  auVar116._12_4_ =
                       ((1.0 - auVar137._12_4_ * fVar202) * fVar202 + fVar202) * (fVar211 + fVar211)
                  ;
                  fVar163 = *(float *)(local_11f0 + local_11f8 * 4 + 0x30);
                  iVar68 = -(uint)(fVar163 <= auVar116._4_4_);
                  iVar69 = -(uint)(fVar163 <= auVar116._8_4_);
                  iVar70 = -(uint)(fVar163 <= auVar116._12_4_);
                  auVar151._8_4_ = iVar69;
                  auVar151._4_4_ = iVar68;
                  auVar151._12_4_ = iVar70;
                  auVar89._0_4_ =
                       -(uint)(auVar116._0_4_ <= fVar236 && fVar163 <= auVar116._0_4_) &
                       auVar248._0_4_;
                  auVar89._4_4_ =
                       -(uint)(auVar116._4_4_ <= fVar236 && fVar163 <= auVar116._4_4_) &
                       auVar248._4_4_;
                  auVar89._8_4_ =
                       -(uint)(auVar116._8_4_ <= fVar236 && fVar163 <= auVar116._8_4_) &
                       auVar248._8_4_;
                  auVar89._12_4_ =
                       -(uint)(auVar116._12_4_ <= fVar236 && fVar163 <= auVar116._12_4_) &
                       auVar248._12_4_;
                  uVar129 = movmskps(iVar49,auVar89);
                  if (uVar129 != 0) {
                    valid.field_0.i[0] = auVar89._0_4_ & -(uint)(auVar137._0_4_ != 0.0);
                    valid.field_0.i[1] = auVar89._4_4_ & -(uint)(auVar137._4_4_ != 0.0);
                    valid.field_0.i[2] = auVar89._8_4_ & -(uint)(auVar137._8_4_ != 0.0);
                    valid.field_0.i[3] = auVar89._12_4_ & -(uint)(auVar137._12_4_ != 0.0);
                    uVar129 = movmskps(uVar129,(undefined1  [16])valid.field_0);
                    if (uVar129 != 0) {
                      auVar44._4_4_ = fVar195;
                      auVar44._0_4_ = fVar210;
                      auVar44._8_4_ = fVar198;
                      auVar44._12_4_ = fVar201;
                      local_12d8 = auVar116;
                      auVar151._0_4_ = (float)(int)(*(ushort *)(lVar23 + 8 + lVar61) - 1);
                      auVar190._4_4_ = iVar68;
                      auVar190._0_4_ = auVar151._0_4_;
                      auVar190._8_4_ = iVar69;
                      auVar190._12_4_ = iVar70;
                      auVar109 = rcpss(auVar190,auVar151);
                      auVar209._4_12_ = local_12b8._4_12_;
                      auVar209._0_4_ = (float)(int)(*(ushort *)(lVar23 + 10 + lVar61) - 1);
                      fVar236 = (2.0 - auVar151._0_4_ * auVar109._0_4_) * auVar109._0_4_;
                      auVar191._4_4_ = fVar213;
                      auVar191._0_4_ = auVar209._0_4_;
                      auVar191._8_4_ = fVar220;
                      auVar191._12_4_ = fVar221;
                      auVar109 = rcpss(auVar191,auVar209);
                      fVar163 = (2.0 - auVar209._0_4_ * auVar109._0_4_) * auVar109._0_4_;
                      tNear.field_0.v[0] = fVar236 * (fVar185 + (float)uVar130 * fVar210);
                      tNear.field_0.v[1] = fVar236 * (fVar196 + (float)(uVar130 + 1) * fVar195);
                      tNear.field_0.v[2] = fVar236 * (fVar199 + (float)(uVar130 + 1) * fVar198);
                      tNear.field_0.v[3] = fVar236 * (fVar235 + (float)uVar130 * fVar201);
                      auVar170._0_4_ = (float)uVar132 * fVar210 + auVar254._0_4_;
                      auVar170._4_4_ = (float)uVar132 * fVar195 + auVar254._4_4_;
                      auVar170._8_4_ = (float)(uVar132 + 1) * fVar198 + auVar254._8_4_;
                      auVar170._12_4_ = (float)(uVar132 + 1) * fVar201 + auVar254._12_4_;
                      pGVar22 = (local_11e8->geometries).items[uVar56].ptr;
                      uVar129 = *(uint *)(local_11f0 + local_11f8 * 4 + 0x90);
                      if ((pGVar22->mask & uVar129) != 0) {
                        auVar109 = rcpps(auVar170,auVar44);
                        fVar236 = auVar109._0_4_;
                        fVar172 = auVar109._4_4_;
                        fVar131 = auVar109._8_4_;
                        fVar202 = auVar109._12_4_;
                        fVar236 = (float)(-(uint)(1e-18 <= fVar238) &
                                         (uint)(((float)DAT_01f7ba10 - fVar210 * fVar236) * fVar236
                                               + fVar236));
                        fVar238 = (float)(-(uint)(1e-18 <= fVar193) &
                                         (uint)((DAT_01f7ba10._4_4_ - fVar195 * fVar172) * fVar172 +
                                               fVar172));
                        fVar193 = (float)(-(uint)(1e-18 <= fVar217) &
                                         (uint)((DAT_01f7ba10._8_4_ - fVar198 * fVar131) * fVar131 +
                                               fVar131));
                        fVar217 = (float)(-(uint)(1e-18 <= fVar108) &
                                         (uint)((DAT_01f7ba10._12_4_ - fVar201 * fVar202) * fVar202
                                               + fVar202));
                        auVar138._0_4_ = tNear.field_0.v[0] * fVar236;
                        auVar138._4_4_ = tNear.field_0.v[1] * fVar238;
                        auVar138._8_4_ = tNear.field_0.v[2] * fVar193;
                        auVar138._12_4_ = tNear.field_0.v[3] * fVar217;
                        local_12f8 = minps(auVar138,_DAT_01f7ba10);
                        auVar152._0_4_ = fVar163 * auVar170._0_4_ * fVar236;
                        auVar152._4_4_ = fVar163 * auVar170._4_4_ * fVar238;
                        auVar152._8_4_ = fVar163 * auVar170._8_4_ * fVar193;
                        auVar152._12_4_ = fVar163 * auVar170._12_4_ * fVar217;
                        local_12e8 = minps(auVar152,_DAT_01f7ba10);
                        auVar146 = blendvps(_DAT_01f7a9f0,auVar116,(undefined1  [16])valid.field_0);
                        auVar153._4_4_ = auVar146._0_4_;
                        auVar153._0_4_ = auVar146._4_4_;
                        auVar153._8_4_ = auVar146._12_4_;
                        auVar153._12_4_ = auVar146._8_4_;
                        auVar109 = minps(auVar153,auVar146);
                        auVar117._0_8_ = auVar109._8_8_;
                        auVar117._8_4_ = auVar109._0_4_;
                        auVar117._12_4_ = auVar109._4_4_;
                        auVar109 = minps(auVar117,auVar109);
                        uVar145 = -(uint)(auVar109._0_4_ == auVar146._0_4_);
                        uVar160 = -(uint)(auVar109._4_4_ == auVar146._4_4_);
                        uVar161 = -(uint)(auVar109._8_4_ == auVar146._8_4_);
                        uVar162 = -(uint)(auVar109._12_4_ == auVar146._12_4_);
                        auVar139._0_4_ = uVar145 & valid.field_0.i[0];
                        auVar139._4_4_ = uVar160 & valid.field_0.i[1];
                        auVar139._8_4_ = uVar161 & valid.field_0.i[2];
                        auVar139._12_4_ = uVar162 & valid.field_0.i[3];
                        iVar49 = movmskps(uVar129,auVar139);
                        uVar129 = 0xffffffff;
                        uVar142 = 0xffffffff;
                        uVar143 = 0xffffffff;
                        uVar144 = 0xffffffff;
                        if (iVar49 != 0) {
                          uVar129 = uVar145;
                          uVar142 = uVar160;
                          uVar143 = uVar161;
                          uVar144 = uVar162;
                        }
                        auVar90._0_4_ = valid.field_0.i[0] & uVar129;
                        auVar90._4_4_ = valid.field_0.i[1] & uVar142;
                        auVar90._8_4_ = valid.field_0.i[2] & uVar143;
                        auVar90._12_4_ = valid.field_0.i[3] & uVar144;
                        uVar129 = movmskps(iVar49,auVar90);
                        lVar66 = 0;
                        if (uVar129 != 0) {
                          for (; (uVar129 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar50 = *(undefined4 *)(local_12f8 + lVar66 * 4);
                          uVar51 = *(undefined4 *)(local_12e8 + lVar66 * 4);
                          uVar16 = *(undefined4 *)(local_12c8 + lVar66 * 4);
                          uVar17 = *(undefined4 *)(local_12b8 + lVar66 * 4);
                          uVar18 = *(undefined4 *)(local_12a8 + lVar66 * 4);
                          *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0x80) =
                               *(undefined4 *)(local_12d8 + lVar66 * 4);
                          *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0xc0) = uVar16;
                          *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0xd0) = uVar17;
                          *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0xe0) = uVar18;
                          *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0xf0) = uVar50;
                          *(undefined4 *)(local_11f0 + local_11f8 * 4 + 0x100) = uVar51;
                          *(uint *)(local_11f0 + local_11f8 * 4 + 0x110) = uVar128;
                          *(uint *)(local_11f0 + local_11f8 * 4 + 0x120) = uVar58;
                          *(uint *)(local_11f0 + local_11f8 * 4 + 0x130) = context->user->instID[0];
                          uVar129 = context->user->instPrimID[0];
                          *(uint *)(local_11f0 + local_11f8 * 4 + 0x140) = uVar129;
                        }
                        else {
                          local_14d8 = CONCAT44(uVar58,uVar58);
                          uStack_14d0._0_4_ = uVar58;
                          uStack_14d0._4_4_ = uVar58;
                          auVar45 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar52);
                          fStack_143c = (float)((ulong)*(undefined8 *)
                                                        (mm_lookupmask_ps + lVar52 + 8) >> 0x20);
                          _local_14c8 = ZEXT416(*(uint *)(local_11f0 + local_11f8 * 4 + 0x80));
                          while( true ) {
                            local_1138 = *(undefined4 *)(local_12f8 + lVar66 * 4);
                            local_1128._4_4_ = *(undefined4 *)(local_12e8 + lVar66 * 4);
                            *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x80) =
                                 *(undefined4 *)(local_12d8 + lVar66 * 4);
                            args.context = context->user;
                            local_1168 = *(undefined4 *)(local_12c8 + lVar66 * 4);
                            local_1158._4_4_ = *(undefined4 *)(local_12b8 + lVar66 * 4);
                            local_1148._4_4_ = *(undefined4 *)(local_12a8 + lVar66 * 4);
                            uStack_1164 = local_1168;
                            uStack_1160 = local_1168;
                            uStack_115c = local_1168;
                            local_1158._0_4_ = local_1158._4_4_;
                            local_1158._8_4_ = local_1158._4_4_;
                            local_1158._12_4_ = local_1158._4_4_;
                            local_1148._0_4_ = local_1148._4_4_;
                            local_1148._8_4_ = local_1148._4_4_;
                            local_1148._12_4_ = local_1148._4_4_;
                            uStack_1134 = local_1138;
                            uStack_1130 = local_1138;
                            uStack_112c = local_1138;
                            local_1128._0_4_ = local_1128._4_4_;
                            local_1128._8_4_ = local_1128._4_4_;
                            local_1128._12_4_ = local_1128._4_4_;
                            local_1118 = CONCAT44(uVar128,uVar128);
                            uStack_1110 = CONCAT44(uVar128,uVar128);
                            local_1108 = local_14d8;
                            uStack_1100 = uStack_14d0;
                            local_10f8 = (args.context)->instID[0];
                            uStack_10f4 = local_10f8;
                            uStack_10f0 = local_10f8;
                            uStack_10ec = local_10f8;
                            local_10e8 = (args.context)->instPrimID[0];
                            uStack_10e4 = local_10e8;
                            uStack_10e0 = local_10e8;
                            uStack_10dc = local_10e8;
                            local_1428._12_4_ = fStack_143c;
                            local_1428._0_12_ = auVar45;
                            args.valid = (int *)local_1428;
                            args.geometryUserPtr = pGVar22->userPtr;
                            args.ray = (RTCRayN *)pRVar48;
                            args.hit = (RTCHitN *)&local_1168;
                            args.N = 4;
                            pRVar55 = (RTCRayN *)pGVar22->intersectionFilterN;
                            if (pRVar55 != (RTCRayN *)0x0) {
                              pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                              uVar56 = local_1418;
                            }
                            if (local_1428 == (undefined1  [16])0x0) {
                              auVar118._8_4_ = 0xffffffff;
                              auVar118._0_8_ = 0xffffffffffffffff;
                              auVar118._12_4_ = 0xffffffff;
                              auVar118 = auVar118 ^ _DAT_01f7ae20;
                            }
                            else {
                              pRVar55 = (RTCRayN *)context->args->filter;
                              if ((pRVar55 != (RTCRayN *)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                                pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                                uVar56 = local_1418;
                              }
                              auVar91._0_4_ = -(uint)(local_1428._0_4_ == 0);
                              auVar91._4_4_ = -(uint)(local_1428._4_4_ == 0);
                              auVar91._8_4_ = -(uint)(local_1428._8_4_ == 0);
                              auVar91._12_4_ = -(uint)(local_1428._12_4_ == 0);
                              auVar118 = auVar91 ^ _DAT_01f7ae20;
                              if (local_1428 != (undefined1  [16])0x0) {
                                auVar109 = blendvps(*(undefined1 (*) [16])args.hit,
                                                    *(undefined1 (*) [16])(args.ray + 0xc0),auVar91)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                    *(undefined1 (*) [16])(args.ray + 0xd0),auVar91)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                    *(undefined1 (*) [16])(args.ray + 0xe0),auVar91)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                    *(undefined1 (*) [16])(args.ray + 0xf0),auVar91)
                                ;
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                    *(undefined1 (*) [16])(args.ray + 0x100),auVar91
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0x100) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                    *(undefined1 (*) [16])(args.ray + 0x110),auVar91
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0x110) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                    *(undefined1 (*) [16])(args.ray + 0x120),auVar91
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0x120) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                    *(undefined1 (*) [16])(args.ray + 0x130),auVar91
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                    *(undefined1 (*) [16])(args.ray + 0x140),auVar91
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0x140) = auVar109;
                                pRVar55 = args.ray;
                              }
                            }
                            if ((_DAT_01f7bb20 & auVar118) == (undefined1  [16])0x0) {
                              *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x80) = local_14c8._0_4_;
                            }
                            else {
                              local_14c8._0_4_ = *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x80);
                              local_14c8._4_4_ = 0;
                              fStack_14c0 = 0.0;
                              fStack_14bc = 0.0;
                            }
                            *(undefined4 *)(local_1428 + lVar66 * 4 + -0x10) = 0;
                            valid.field_0.i[0] =
                                 -(uint)(auVar116._0_4_ <= (float)local_14c8._0_4_) &
                                 valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(auVar116._4_4_ <= (float)local_14c8._0_4_) &
                                 valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(auVar116._8_4_ <= (float)local_14c8._0_4_) &
                                 valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(auVar116._12_4_ <= (float)local_14c8._0_4_) &
                                 valid.field_0.i[3];
                            iVar49 = movmskps((int)pRVar55,(undefined1  [16])valid.field_0);
                            if (iVar49 == 0) break;
                            auVar146 = blendvps(_DAT_01f7a9f0,auVar116,
                                                (undefined1  [16])valid.field_0);
                            auVar154._4_4_ = auVar146._0_4_;
                            auVar154._0_4_ = auVar146._4_4_;
                            auVar154._8_4_ = auVar146._12_4_;
                            auVar154._12_4_ = auVar146._8_4_;
                            auVar109 = minps(auVar154,auVar146);
                            auVar119._0_8_ = auVar109._8_8_;
                            auVar119._8_4_ = auVar109._0_4_;
                            auVar119._12_4_ = auVar109._4_4_;
                            auVar109 = minps(auVar119,auVar109);
                            auVar120._0_8_ =
                                 CONCAT44(-(uint)(auVar109._4_4_ == auVar146._4_4_) &
                                          valid.field_0.i[1],
                                          -(uint)(auVar109._0_4_ == auVar146._0_4_) &
                                          valid.field_0.i[0]);
                            auVar120._8_4_ =
                                 -(uint)(auVar109._8_4_ == auVar146._8_4_) & valid.field_0.i[2];
                            auVar120._12_4_ =
                                 -(uint)(auVar109._12_4_ == auVar146._12_4_) & valid.field_0.i[3];
                            iVar49 = movmskps(iVar49,auVar120);
                            aVar92 = valid.field_0;
                            if (iVar49 != 0) {
                              aVar92.i[2] = auVar120._8_4_;
                              aVar92._0_8_ = auVar120._0_8_;
                              aVar92.i[3] = auVar120._12_4_;
                            }
                            uVar50 = movmskps(iVar49,(undefined1  [16])aVar92);
                            uVar62 = CONCAT44((int)((ulong)pRVar55 >> 0x20),uVar50);
                            lVar66 = 0;
                            if (uVar62 != 0) {
                              for (; (uVar62 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                              }
                            }
                          }
                          fVar218 = *(float *)(pRVar48 + sVar47 * 4 + 0x10);
                          fVar253 = *(float *)(pRVar48 + sVar47 * 4 + 0x20);
                          fStack_146c = *(float *)(pRVar48 + sVar47 * 4 + 0x40);
                          local_14c8._4_4_ = *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x50);
                          local_14c8._0_4_ = local_14c8._4_4_;
                          fStack_14c0 = (float)local_14c8._4_4_;
                          fStack_14bc = (float)local_14c8._4_4_;
                          local_14d8._4_4_ = *(float *)(pRVar48 + sVar47 * 4 + 0x60);
                          local_14d8._0_4_ = local_14d8._4_4_;
                          uStack_14d0._0_4_ = local_14d8._4_4_;
                          uStack_14d0._4_4_ = local_14d8._4_4_;
                          local_1448 = local_1098 - fVar218;
                          fStack_1444 = fStack_1094 - fVar218;
                          fStack_1440 = fStack_1090 - fVar218;
                          fStack_143c = fStack_108c - fVar218;
                          fVar214 = (float)local_1068 - fVar253;
                          fVar260 = local_1068._4_4_ - fVar253;
                          fVar266 = fStack_1060 - fVar253;
                          fVar263 = fStack_105c - fVar253;
                          fVar240 = local_1088 - fVar218;
                          fVar244 = fStack_1084 - fVar218;
                          fVar267 = fStack_1080 - fVar218;
                          fVar245 = fStack_107c - fVar218;
                          fVar228 = local_1078 - fVar253;
                          fVar229 = fStack_1074 - fVar253;
                          fVar230 = fStack_1070 - fVar253;
                          fVar232 = fStack_106c - fVar253;
                          fStack_1384 = fStack_1444 + fVar244;
                          local_1388 = local_1448 + fVar240;
                          fStack_1380 = fStack_1440 + fVar267;
                          fStack_137c = fStack_143c + fVar245;
                          fStack_1374 = fVar260 + fVar229;
                          local_1378 = fVar214 + fVar228;
                          fStack_1370 = fVar266 + fVar230;
                          fStack_136c = fVar263 + fVar232;
                          uVar129 = 0;
                        }
                      }
                    }
                  }
                }
                local_1248 = local_1248 - fVar253;
                fStack_1244 = fStack_1244 - fVar253;
                fStack_1240 = fStack_1240 - fVar253;
                fStack_123c = fStack_123c - fVar253;
                fVar231 = fVar231 - fVar218;
                fVar212 = fVar212 - fVar218;
                fVar215 = ((fVar183 - fVar256) * fVar216 + fVar256) - fVar218;
                fVar219 = fVar219 - fVar218;
                fVar236 = *(float *)(pRVar48 + sVar47 * 4);
                fVar227 = fVar227 - fVar236;
                fVar181 = fVar181 - fVar236;
                fStack_1480 = fStack_1480 - fVar236;
                fStack_147c = fStack_147c - fVar236;
                fVar253 = (float)local_1268 - fVar236;
                fVar256 = local_1268._4_4_ - fVar236;
                fVar163 = fStack_1260 - fVar236;
                fVar172 = fStack_125c - fVar236;
                fVar195 = local_1258 - fVar236;
                fVar198 = fStack_1254 - fVar236;
                fVar201 = fStack_1250 - fVar236;
                fVar236 = fStack_124c - fVar236;
                fVar268 = fVar195 - fVar227;
                fVar272 = fVar198 - fVar181;
                fStack_1250 = fVar201 - fStack_1480;
                fStack_124c = fVar236 - fStack_147c;
                fVar193 = fVar240 - fVar231;
                fVar108 = fVar244 - fVar212;
                fVar202 = fVar267 - fVar215;
                fVar235 = fVar245 - fVar219;
                fVar221 = fVar228 - local_1248;
                fVar233 = fVar229 - fStack_1244;
                fStack_1260 = fVar230 - fStack_1240;
                fStack_125c = fVar232 - fStack_123c;
                fVar216 = local_1448 - fVar240;
                fVar238 = fStack_1444 - fVar244;
                fVar218 = fStack_1440 - fVar267;
                fVar183 = fStack_143c - fVar245;
                fVar203 = fVar214 - fVar228;
                fVar211 = fVar260 - fVar229;
                fVar213 = fVar266 - fVar230;
                fVar220 = fVar263 - fVar232;
                _local_1258 = CONCAT44(fVar272,fVar268);
                local_1268 = CONCAT44(fVar233,fVar221);
                fVar222 = fVar227 - fVar253;
                fVar234 = fVar181 - fVar256;
                fVar237 = fStack_1480 - fVar163;
                fVar264 = fStack_147c - fVar172;
                fVar270 = fVar231 - local_1448;
                fVar274 = fVar212 - fStack_1444;
                fVar251 = fVar215 - fStack_1440;
                fVar252 = fVar219 - fStack_143c;
                fVar269 = (float)local_14d8;
                fVar271 = local_14d8._4_4_;
                fVar273 = local_14d8._8_4_;
                fVar275 = local_14d8._12_4_;
                fVar217 = local_1248 - fVar214;
                fVar131 = fStack_1244 - fVar260;
                fVar210 = fStack_1240 - fVar266;
                fVar182 = fStack_123c - fVar263;
                fVar257 = (fVar193 * (fVar228 + local_1248) - (fVar240 + fVar231) * fVar221) *
                          fStack_146c +
                          ((fVar195 + fVar227) * fVar221 - (fVar228 + local_1248) * fVar268) *
                          (float)local_14c8._0_4_ +
                          (fVar268 * (fVar240 + fVar231) - (fVar195 + fVar227) * fVar193) * fVar269;
                fVar261 = (fVar108 * (fVar229 + fStack_1244) - (fVar244 + fVar212) * fVar233) *
                          fStack_146c +
                          ((fVar198 + fVar181) * fVar233 - (fVar229 + fStack_1244) * fVar272) *
                          (float)local_14c8._4_4_ +
                          (fVar272 * (fVar244 + fVar212) - (fVar198 + fVar181) * fVar108) * fVar271;
                fVar262 = (fVar202 * (fVar230 + fStack_1240) - (fVar267 + fVar215) * fStack_1260) *
                          fStack_146c +
                          ((fVar201 + fStack_1480) * fStack_1260 -
                          (fVar230 + fStack_1240) * fStack_1250) * fStack_14c0 +
                          (fStack_1250 * (fVar267 + fVar215) - (fVar201 + fStack_1480) * fVar202) *
                          fVar273;
                fVar265 = (fVar235 * (fVar232 + fStack_123c) - (fVar245 + fVar219) * fStack_125c) *
                          fStack_146c +
                          ((fVar236 + fStack_147c) * fStack_125c -
                          (fVar232 + fStack_123c) * fStack_124c) * fStack_14bc +
                          (fStack_124c * (fVar245 + fVar219) - (fVar236 + fStack_147c) * fVar235) *
                          fVar275;
                fVar228 = fVar253 - fVar195;
                fVar229 = fVar256 - fVar198;
                fVar230 = fVar163 - fVar201;
                fVar232 = fVar172 - fVar236;
                auVar178._0_4_ =
                     (fVar270 * (fVar214 + local_1248) - (local_1448 + fVar231) * fVar217) *
                     fStack_146c +
                     ((fVar227 + fVar253) * fVar217 - (fVar214 + local_1248) * fVar222) *
                     (float)local_14c8._0_4_ +
                     (fVar222 * (local_1448 + fVar231) - (fVar227 + fVar253) * fVar270) * fVar269;
                auVar178._4_4_ =
                     (fVar274 * (fVar260 + fStack_1244) - (fStack_1444 + fVar212) * fVar131) *
                     fStack_146c +
                     ((fVar181 + fVar256) * fVar131 - (fVar260 + fStack_1244) * fVar234) *
                     (float)local_14c8._4_4_ +
                     (fVar234 * (fStack_1444 + fVar212) - (fVar181 + fVar256) * fVar274) * fVar271;
                auVar178._8_4_ =
                     (fVar251 * (fVar266 + fStack_1240) - (fStack_1440 + fVar215) * fVar210) *
                     fStack_146c +
                     ((fStack_1480 + fVar163) * fVar210 - (fVar266 + fStack_1240) * fVar237) *
                     fStack_14c0 +
                     (fVar237 * (fStack_1440 + fVar215) - (fStack_1480 + fVar163) * fVar251) *
                     fVar273;
                auVar178._12_4_ =
                     (fVar252 * (fVar263 + fStack_123c) - (fStack_143c + fVar219) * fVar182) *
                     fStack_146c +
                     ((fStack_147c + fVar172) * fVar182 - (fVar263 + fStack_123c) * fVar264) *
                     fStack_14bc +
                     (fVar264 * (fStack_143c + fVar219) - (fStack_147c + fVar172) * fVar252) *
                     fVar275;
                auVar93._0_4_ =
                     (fVar216 * local_1378 - local_1388 * fVar203) * fStack_146c +
                     ((fVar195 + fVar253) * fVar203 - local_1378 * fVar228) *
                     (float)local_14c8._0_4_ +
                     (fVar228 * local_1388 - (fVar195 + fVar253) * fVar216) * fVar269;
                auVar93._4_4_ =
                     (fVar238 * fStack_1374 - fStack_1384 * fVar211) * fStack_146c +
                     ((fVar198 + fVar256) * fVar211 - fStack_1374 * fVar229) *
                     (float)local_14c8._4_4_ +
                     (fVar229 * fStack_1384 - (fVar198 + fVar256) * fVar238) * fVar271;
                auVar93._8_4_ =
                     (fVar218 * fStack_1370 - fStack_1380 * fVar213) * fStack_146c +
                     ((fVar201 + fVar163) * fVar213 - fStack_1370 * fVar230) * fStack_14c0 +
                     (fVar230 * fStack_1380 - (fVar201 + fVar163) * fVar218) * fVar273;
                auVar93._12_4_ =
                     (fVar183 * fStack_136c - fStack_137c * fVar220) * fStack_146c +
                     ((fVar236 + fVar172) * fVar220 - fStack_136c * fVar232) * fStack_14bc +
                     (fVar232 * fStack_137c - (fVar236 + fVar172) * fVar183) * fVar275;
                fVar236 = fVar257 + auVar178._0_4_ + auVar93._0_4_;
                fVar214 = fVar261 + auVar178._4_4_ + auVar93._4_4_;
                fVar260 = fVar262 + auVar178._8_4_ + auVar93._8_4_;
                fVar276 = fVar265 + auVar178._12_4_ + auVar93._12_4_;
                local_1278._0_8_ = CONCAT44(fVar214,fVar236) & 0x7fffffff7fffffff;
                local_1278._8_4_ = ABS(fVar260);
                local_1278._12_4_ = ABS(fVar276);
                auVar121._8_4_ = fVar262;
                auVar121._0_8_ = CONCAT44(fVar261,fVar257);
                auVar121._12_4_ = fVar265;
                auVar109 = minps(auVar121,auVar178);
                auVar146 = minps(auVar109,auVar93);
                auVar225._8_4_ = fVar262;
                auVar225._0_8_ = CONCAT44(fVar261,fVar257);
                auVar225._12_4_ = fVar265;
                auVar109 = maxps(auVar225,auVar178);
                auVar175 = maxps(auVar109,auVar93);
                auVar109 = local_1278;
                auVar226._4_4_ = -(uint)(auVar175._4_4_ <= ABS(fVar214) * 1.1920929e-07);
                auVar226._0_4_ = -(uint)(auVar175._0_4_ <= ABS(fVar236) * 1.1920929e-07);
                auVar226._8_4_ = -(uint)(auVar175._8_4_ <= local_1278._8_4_ * 1.1920929e-07);
                auVar226._12_4_ = -(uint)(auVar175._12_4_ <= local_1278._12_4_ * 1.1920929e-07);
                auVar122._4_4_ = -(uint)(-(ABS(fVar214) * 1.1920929e-07) <= auVar146._4_4_);
                auVar122._0_4_ = -(uint)(-(ABS(fVar236) * 1.1920929e-07) <= auVar146._0_4_);
                auVar122._8_4_ = -(uint)(-(local_1278._8_4_ * 1.1920929e-07) <= auVar146._8_4_);
                auVar122._12_4_ = -(uint)(-(local_1278._12_4_ * 1.1920929e-07) <= auVar146._12_4_);
                auVar226 = auVar226 | auVar122;
                iVar49 = movmskps(uVar129,auVar226);
                ray = pRVar48;
                uVar62 = local_1200;
                uVar64 = local_1208;
                k = sVar47;
                uVar67 = local_1210;
                aVar246 = bi_2.field_0;
                fVar266 = local_10c8;
                fVar263 = fStack_10c4;
                fVar240 = fStack_10c0;
                fVar244 = fStack_10bc;
                fVar267 = local_10d8;
                fVar245 = fStack_10d4;
                fVar163 = fStack_10d0;
                fVar172 = fStack_10cc;
                fVar253 = local_10a8;
                fVar195 = fStack_10a4;
                fVar198 = fStack_10a0;
                fVar201 = fStack_109c;
                fVar256 = local_10b8;
                fVar185 = fStack_10b4;
                fVar196 = fStack_10b0;
                fVar199 = fStack_10ac;
                if (iVar49 != 0) {
                  auVar259._0_4_ = fVar193 * fVar217 - fVar270 * fVar221;
                  auVar259._4_4_ = fVar108 * fVar131 - fVar274 * fVar233;
                  auVar259._8_4_ = fVar202 * fVar210 - fVar251 * fStack_1260;
                  auVar259._12_4_ = fVar235 * fVar182 - fVar252 * fStack_125c;
                  auVar249._0_4_ = fVar270 * fVar203 - fVar216 * fVar217;
                  auVar249._4_4_ = fVar274 * fVar211 - fVar238 * fVar131;
                  auVar249._8_4_ = fVar251 * fVar213 - fVar218 * fVar210;
                  auVar249._12_4_ = fVar252 * fVar220 - fVar183 * fVar182;
                  auVar94._4_4_ = -(uint)(ABS(fVar274 * fVar233) < ABS(fVar238 * fVar131));
                  auVar94._0_4_ = -(uint)(ABS(fVar270 * fVar221) < ABS(fVar216 * fVar217));
                  auVar94._8_4_ = -(uint)(ABS(fVar251 * fStack_1260) < ABS(fVar218 * fVar210));
                  auVar94._12_4_ = -(uint)(ABS(fVar252 * fStack_125c) < ABS(fVar183 * fVar182));
                  local_12c8 = blendvps(auVar249,auVar259,auVar94);
                  auVar179._0_4_ = fVar221 * fVar222 - fVar268 * fVar217;
                  auVar179._4_4_ = fVar233 * fVar234 - fVar272 * fVar131;
                  auVar179._8_4_ = fStack_1260 * fVar237 - fStack_1250 * fVar210;
                  auVar179._12_4_ = fStack_125c * fVar264 - fStack_124c * fVar182;
                  auVar255._0_4_ = fVar228 * fVar217 - fVar222 * fVar203;
                  auVar255._4_4_ = fVar229 * fVar131 - fVar234 * fVar211;
                  auVar255._8_4_ = fVar230 * fVar210 - fVar237 * fVar213;
                  auVar255._12_4_ = fVar232 * fVar182 - fVar264 * fVar220;
                  auVar95._4_4_ = -(uint)(ABS(fVar272 * fVar131) < ABS(fVar234 * fVar211));
                  auVar95._0_4_ = -(uint)(ABS(fVar268 * fVar217) < ABS(fVar222 * fVar203));
                  auVar95._8_4_ = -(uint)(ABS(fStack_1250 * fVar210) < ABS(fVar237 * fVar213));
                  auVar95._12_4_ = -(uint)(ABS(fStack_124c * fVar182) < ABS(fVar264 * fVar220));
                  local_12b8 = blendvps(auVar255,auVar179,auVar95);
                  auVar171._0_4_ = fVar268 * fVar270 - fVar222 * fVar193;
                  auVar171._4_4_ = fVar272 * fVar274 - fVar234 * fVar108;
                  auVar171._8_4_ = fStack_1250 * fVar251 - fVar237 * fVar202;
                  auVar171._12_4_ = fStack_124c * fVar252 - fVar264 * fVar235;
                  auVar241._0_4_ = fVar222 * fVar216 - fVar228 * fVar270;
                  auVar241._4_4_ = fVar234 * fVar238 - fVar229 * fVar274;
                  auVar241._8_4_ = fVar237 * fVar218 - fVar230 * fVar251;
                  auVar241._12_4_ = fVar264 * fVar183 - fVar232 * fVar252;
                  auVar96._4_4_ = -(uint)(ABS(fVar234 * fVar108) < ABS(fVar229 * fVar274));
                  auVar96._0_4_ = -(uint)(ABS(fVar222 * fVar193) < ABS(fVar228 * fVar270));
                  auVar96._8_4_ = -(uint)(ABS(fVar237 * fVar202) < ABS(fVar230 * fVar251));
                  auVar96._12_4_ = -(uint)(ABS(fVar264 * fVar235) < ABS(fVar232 * fVar252));
                  local_12a8 = blendvps(auVar241,auVar171,auVar96);
                  auVar155._0_4_ =
                       (float)local_14c8._0_4_ * local_12b8._0_4_ + fVar269 * local_12a8._0_4_;
                  auVar155._4_4_ =
                       (float)local_14c8._4_4_ * local_12b8._4_4_ + fVar271 * local_12a8._4_4_;
                  auVar155._8_4_ = fStack_14c0 * local_12b8._8_4_ + fVar273 * local_12a8._8_4_;
                  auVar155._12_4_ = fStack_14bc * local_12b8._12_4_ + fVar275 * local_12a8._12_4_;
                  fVar216 = fStack_146c * local_12c8._0_4_ + auVar155._0_4_;
                  fVar238 = fStack_146c * local_12c8._4_4_ + auVar155._4_4_;
                  fVar218 = fStack_146c * local_12c8._8_4_ + auVar155._8_4_;
                  fVar183 = fStack_146c * local_12c8._12_4_ + auVar155._12_4_;
                  auVar192._0_4_ = fVar216 + fVar216;
                  auVar192._4_4_ = fVar238 + fVar238;
                  auVar192._8_4_ = fVar218 + fVar218;
                  auVar192._12_4_ = fVar183 + fVar183;
                  auVar97._0_4_ = fVar231 * local_12b8._0_4_ + local_1248 * local_12a8._0_4_;
                  auVar97._4_4_ = fVar212 * local_12b8._4_4_ + fStack_1244 * local_12a8._4_4_;
                  auVar97._8_4_ = fVar215 * local_12b8._8_4_ + fStack_1240 * local_12a8._8_4_;
                  auVar97._12_4_ = fVar219 * local_12b8._12_4_ + fStack_123c * local_12a8._12_4_;
                  fVar193 = fVar227 * local_12c8._0_4_ + auVar97._0_4_;
                  fVar217 = fVar181 * local_12c8._4_4_ + auVar97._4_4_;
                  fVar108 = fStack_1480 * local_12c8._8_4_ + auVar97._8_4_;
                  fVar219 = fStack_147c * local_12c8._12_4_ + auVar97._12_4_;
                  auVar146 = rcpps(auVar97,auVar192);
                  fVar216 = auVar146._0_4_;
                  fVar238 = auVar146._4_4_;
                  fVar218 = auVar146._8_4_;
                  fVar183 = auVar146._12_4_;
                  auVar123._0_4_ =
                       ((1.0 - auVar192._0_4_ * fVar216) * fVar216 + fVar216) * (fVar193 + fVar193);
                  auVar123._4_4_ =
                       ((1.0 - auVar192._4_4_ * fVar238) * fVar238 + fVar238) * (fVar217 + fVar217);
                  auVar123._8_4_ =
                       ((1.0 - auVar192._8_4_ * fVar218) * fVar218 + fVar218) * (fVar108 + fVar108);
                  auVar123._12_4_ =
                       ((1.0 - auVar192._12_4_ * fVar183) * fVar183 + fVar183) * (fVar219 + fVar219)
                  ;
                  fVar238 = *(float *)(pRVar48 + sVar47 * 4 + 0x80);
                  fVar216 = *(float *)(pRVar48 + sVar47 * 4 + 0x30);
                  auVar98._0_4_ =
                       -(uint)(auVar123._0_4_ <= fVar238 && fVar216 <= auVar123._0_4_) &
                       auVar226._0_4_;
                  auVar98._4_4_ =
                       -(uint)(auVar123._4_4_ <= fVar238 && fVar216 <= auVar123._4_4_) &
                       auVar226._4_4_;
                  auVar98._8_4_ =
                       -(uint)(auVar123._8_4_ <= fVar238 && fVar216 <= auVar123._8_4_) &
                       auVar226._8_4_;
                  auVar98._12_4_ =
                       -(uint)(auVar123._12_4_ <= fVar238 && fVar216 <= auVar123._12_4_) &
                       auVar226._12_4_;
                  iVar49 = movmskps(iVar49,auVar98);
                  if (iVar49 != 0) {
                    valid.field_0.i[0] = auVar98._0_4_ & -(uint)(auVar192._0_4_ != 0.0);
                    valid.field_0.i[1] = auVar98._4_4_ & -(uint)(auVar192._4_4_ != 0.0);
                    valid.field_0.i[2] = auVar98._8_4_ & -(uint)(auVar192._8_4_ != 0.0);
                    valid.field_0.i[3] = auVar98._12_4_ & -(uint)(auVar192._12_4_ != 0.0);
                    iVar49 = movmskps(iVar49,(undefined1  [16])valid.field_0);
                    if (iVar49 != 0) {
                      local_12d8 = auVar123;
                      auVar180._0_4_ = fVar236 - auVar178._0_4_;
                      auVar180._4_4_ = fVar214 - auVar178._4_4_;
                      auVar180._8_4_ = fVar260 - auVar178._8_4_;
                      auVar180._12_4_ = fVar276 - auVar178._12_4_;
                      auVar156._4_12_ = auVar155._4_12_;
                      auVar156._0_4_ = (float)(int)(*(ushort *)(lVar23 + 8 + lVar61) - 1);
                      auVar242._4_4_ = auVar155._4_4_;
                      auVar242._0_4_ = auVar156._0_4_;
                      auVar242._8_4_ = auVar155._8_4_;
                      auVar242._12_4_ = auVar155._12_4_;
                      auVar146 = rcpss(auVar242,auVar156);
                      fVar216 = (2.0 - auVar156._0_4_ * auVar146._0_4_) * auVar146._0_4_;
                      auVar243._4_12_ = auVar146._4_12_;
                      auVar243._0_4_ = (float)(int)(*(ushort *)(lVar23 + 10 + lVar61) - 1);
                      auVar250._4_4_ = auVar146._4_4_;
                      auVar250._0_4_ = auVar243._0_4_;
                      auVar250._8_4_ = auVar146._8_4_;
                      auVar250._12_4_ = auVar146._12_4_;
                      auVar146 = rcpss(auVar250,auVar243);
                      fVar218 = (2.0 - auVar243._0_4_ * auVar146._0_4_) * auVar146._0_4_;
                      tNear.field_0.v[0] =
                           fVar216 * ((float)uVar130 * fVar236 + (fVar236 - fVar257));
                      tNear.field_0.v[1] =
                           fVar216 * ((float)(uVar130 + 1) * fVar214 + (fVar214 - fVar261));
                      tNear.field_0.v[2] =
                           fVar216 * ((float)(uVar130 + 1) * fVar260 + (fVar260 - fVar262));
                      tNear.field_0.v[3] =
                           fVar216 * ((float)uVar130 * fVar276 + (fVar276 - fVar265));
                      pGVar22 = (context->scene->geometries).items[uVar56].ptr;
                      if ((pGVar22->mask & *(uint *)(pRVar48 + sVar47 * 4 + 0x90)) != 0) {
                        auVar42._4_4_ = fVar214;
                        auVar42._0_4_ = fVar236;
                        auVar42._8_4_ = fVar260;
                        auVar42._12_4_ = fVar276;
                        auVar146 = rcpps(auVar180,auVar42);
                        fVar216 = auVar146._0_4_;
                        fVar183 = auVar146._4_4_;
                        fVar193 = auVar146._8_4_;
                        fVar217 = auVar146._12_4_;
                        local_1278._4_4_ = (undefined4)(local_1278._0_8_ >> 0x20);
                        fVar216 = (float)(-(uint)(1e-18 <= (float)local_1278._0_4_) &
                                         (uint)(((float)DAT_01f7ba10 - fVar236 * fVar216) * fVar216
                                               + fVar216));
                        fVar183 = (float)(-(uint)(1e-18 <= (float)local_1278._4_4_) &
                                         (uint)((DAT_01f7ba10._4_4_ - fVar214 * fVar183) * fVar183 +
                                               fVar183));
                        fVar193 = (float)(-(uint)(1e-18 <= local_1278._8_4_) &
                                         (uint)((DAT_01f7ba10._8_4_ - fVar260 * fVar193) * fVar193 +
                                               fVar193));
                        fVar217 = (float)(-(uint)(1e-18 <= local_1278._12_4_) &
                                         (uint)((DAT_01f7ba10._12_4_ - fVar276 * fVar217) * fVar217
                                               + fVar217));
                        auVar140._0_4_ = tNear.field_0.v[0] * fVar216;
                        auVar140._4_4_ = tNear.field_0.v[1] * fVar183;
                        auVar140._8_4_ = tNear.field_0.v[2] * fVar193;
                        auVar140._12_4_ = tNear.field_0.v[3] * fVar217;
                        local_12f8 = minps(auVar140,_DAT_01f7ba10);
                        auVar157._0_4_ =
                             fVar218 * ((float)uVar132 * fVar236 + auVar180._0_4_) * fVar216;
                        auVar157._4_4_ =
                             fVar218 * ((float)uVar132 * fVar214 + auVar180._4_4_) * fVar183;
                        auVar157._8_4_ =
                             fVar218 * ((float)(uVar132 + 1) * fVar260 + auVar180._8_4_) * fVar193;
                        auVar157._12_4_ =
                             fVar218 * ((float)(uVar132 + 1) * fVar276 + auVar180._12_4_) * fVar217;
                        local_12e8 = minps(auVar157,_DAT_01f7ba10);
                        auVar175 = blendvps(_DAT_01f7a9f0,auVar123,(undefined1  [16])valid.field_0);
                        auVar158._4_4_ = auVar175._0_4_;
                        auVar158._0_4_ = auVar175._4_4_;
                        auVar158._8_4_ = auVar175._12_4_;
                        auVar158._12_4_ = auVar175._8_4_;
                        auVar146 = minps(auVar158,auVar175);
                        auVar124._0_8_ = auVar146._8_8_;
                        auVar124._8_4_ = auVar146._0_4_;
                        auVar124._12_4_ = auVar146._4_4_;
                        auVar146 = minps(auVar124,auVar146);
                        uVar132 = -(uint)(auVar146._0_4_ == auVar175._0_4_);
                        uVar142 = -(uint)(auVar146._4_4_ == auVar175._4_4_);
                        uVar143 = -(uint)(auVar146._8_4_ == auVar175._8_4_);
                        uVar144 = -(uint)(auVar146._12_4_ == auVar175._12_4_);
                        auVar141._0_4_ = uVar132 & valid.field_0.i[0];
                        auVar141._4_4_ = uVar142 & valid.field_0.i[1];
                        auVar141._8_4_ = uVar143 & valid.field_0.i[2];
                        auVar141._12_4_ = uVar144 & valid.field_0.i[3];
                        iVar49 = movmskps(*(uint *)(pRVar48 + sVar47 * 4 + 0x90),auVar141);
                        uVar58 = 0xffffffff;
                        uVar128 = 0xffffffff;
                        uVar129 = 0xffffffff;
                        uVar130 = 0xffffffff;
                        if (iVar49 != 0) {
                          uVar58 = uVar132;
                          uVar128 = uVar142;
                          uVar129 = uVar143;
                          uVar130 = uVar144;
                        }
                        auVar99._0_4_ = valid.field_0.i[0] & uVar58;
                        auVar99._4_4_ = valid.field_0.i[1] & uVar128;
                        auVar99._8_4_ = valid.field_0.i[2] & uVar129;
                        auVar99._12_4_ = valid.field_0.i[3] & uVar130;
                        uVar58 = movmskps(iVar49,auVar99);
                        lVar66 = 0;
                        if (uVar58 != 0) {
                          for (; (uVar58 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                          }
                        }
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar50 = *(undefined4 *)(local_12f8 + lVar66 * 4);
                          uVar51 = *(undefined4 *)(local_12e8 + lVar66 * 4);
                          uVar16 = *(undefined4 *)(local_12c8 + lVar66 * 4);
                          uVar17 = *(undefined4 *)(local_12b8 + lVar66 * 4);
                          uVar18 = *(undefined4 *)(local_12a8 + lVar66 * 4);
                          *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x80) =
                               *(undefined4 *)(local_12d8 + lVar66 * 4);
                          *(undefined4 *)(pRVar48 + sVar47 * 4 + 0xc0) = uVar16;
                          *(undefined4 *)(pRVar48 + sVar47 * 4 + 0xd0) = uVar17;
                          *(undefined4 *)(pRVar48 + sVar47 * 4 + 0xe0) = uVar18;
                          *(undefined4 *)(pRVar48 + sVar47 * 4 + 0xf0) = uVar50;
                          *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x100) = uVar51;
                          *(int *)(pRVar48 + sVar47 * 4 + 0x110) = (int)local_1410;
                          *(int *)(pRVar48 + sVar47 * 4 + 0x120) = (int)uVar56;
                          *(uint *)(pRVar48 + sVar47 * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(pRVar48 + sVar47 * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_14d8 = CONCAT44(local_1198._0_4_,local_1198._0_4_);
                          uStack_14d0._0_4_ = local_1198._0_4_;
                          uStack_14d0._4_4_ = local_1198._0_4_;
                          uVar50 = local_11a8._0_4_;
                          auVar45 = *(undefined1 (*) [12])(mm_lookupmask_ps + lVar52);
                          fStack_1480 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar52 + 8);
                          fStack_147c = (float)((ulong)*(undefined8 *)
                                                        (mm_lookupmask_ps + lVar52 + 8) >> 0x20);
                          local_1278 = auVar109;
                          while( true ) {
                            local_1138 = *(undefined4 *)(local_12f8 + lVar66 * 4);
                            uVar51 = *(undefined4 *)(local_12e8 + lVar66 * 4);
                            *(undefined4 *)(pRVar48 + sVar47 * 4 + 0x80) =
                                 *(undefined4 *)(local_12d8 + lVar66 * 4);
                            args.context = context->user;
                            local_1128._4_4_ = uVar51;
                            local_1128._0_4_ = uVar51;
                            local_1128._8_4_ = uVar51;
                            local_1128._12_4_ = uVar51;
                            local_1168 = *(undefined4 *)(local_12c8 + lVar66 * 4);
                            uVar51 = *(undefined4 *)(local_12b8 + lVar66 * 4);
                            uVar16 = *(undefined4 *)(local_12a8 + lVar66 * 4);
                            local_1158._4_4_ = uVar51;
                            local_1158._0_4_ = uVar51;
                            local_1158._8_4_ = uVar51;
                            local_1158._12_4_ = uVar51;
                            local_1148._4_4_ = uVar16;
                            local_1148._0_4_ = uVar16;
                            local_1148._8_4_ = uVar16;
                            local_1148._12_4_ = uVar16;
                            uStack_1164 = local_1168;
                            uStack_1160 = local_1168;
                            uStack_115c = local_1168;
                            uStack_1134 = local_1138;
                            uStack_1130 = local_1138;
                            uStack_112c = local_1138;
                            local_1118 = CONCAT44(uVar50,uVar50);
                            uStack_1110 = CONCAT44(uVar50,uVar50);
                            local_1108 = local_14d8;
                            uStack_1100 = uStack_14d0;
                            local_10f8 = (args.context)->instID[0];
                            uStack_10f4 = local_10f8;
                            uStack_10f0 = local_10f8;
                            uStack_10ec = local_10f8;
                            local_10e8 = (args.context)->instPrimID[0];
                            uStack_10e4 = local_10e8;
                            uStack_10e0 = local_10e8;
                            uStack_10dc = local_10e8;
                            local_1428._12_4_ = fStack_147c;
                            local_1428._0_12_ = auVar45;
                            args.valid = (int *)local_1428;
                            args.geometryUserPtr = pGVar22->userPtr;
                            args.ray = (RTCRayN *)pRVar48;
                            args.hit = (RTCHitN *)&local_1168;
                            args.N = 4;
                            pRVar55 = (RTCRayN *)pGVar22->intersectionFilterN;
                            if (pRVar55 != (RTCRayN *)0x0) {
                              pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                            }
                            if (local_1428 == (undefined1  [16])0x0) {
                              auVar125._8_4_ = 0xffffffff;
                              auVar125._0_8_ = 0xffffffffffffffff;
                              auVar125._12_4_ = 0xffffffff;
                              auVar125 = auVar125 ^ _DAT_01f7ae20;
                            }
                            else {
                              pRVar55 = (RTCRayN *)context->args->filter;
                              if ((pRVar55 != (RTCRayN *)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                                pRVar55 = (RTCRayN *)(*(code *)pRVar55)(&args);
                              }
                              auVar100._0_4_ = -(uint)(local_1428._0_4_ == 0);
                              auVar100._4_4_ = -(uint)(local_1428._4_4_ == 0);
                              auVar100._8_4_ = -(uint)(local_1428._8_4_ == 0);
                              auVar100._12_4_ = -(uint)(local_1428._12_4_ == 0);
                              auVar125 = auVar100 ^ _DAT_01f7ae20;
                              if (local_1428 != (undefined1  [16])0x0) {
                                auVar109 = blendvps(*(undefined1 (*) [16])args.hit,
                                                    *(undefined1 (*) [16])(args.ray + 0xc0),auVar100
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                                    *(undefined1 (*) [16])(args.ray + 0xd0),auVar100
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                                    *(undefined1 (*) [16])(args.ray + 0xe0),auVar100
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                                    *(undefined1 (*) [16])(args.ray + 0xf0),auVar100
                                                   );
                                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                                    *(undefined1 (*) [16])(args.ray + 0x100),
                                                    auVar100);
                                *(undefined1 (*) [16])(args.ray + 0x100) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                                    *(undefined1 (*) [16])(args.ray + 0x110),
                                                    auVar100);
                                *(undefined1 (*) [16])(args.ray + 0x110) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                                    *(undefined1 (*) [16])(args.ray + 0x120),
                                                    auVar100);
                                *(undefined1 (*) [16])(args.ray + 0x120) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                                    *(undefined1 (*) [16])(args.ray + 0x130),
                                                    auVar100);
                                *(undefined1 (*) [16])(args.ray + 0x130) = auVar109;
                                auVar109 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                                    *(undefined1 (*) [16])(args.ray + 0x140),
                                                    auVar100);
                                *(undefined1 (*) [16])(args.ray + 0x140) = auVar109;
                                pRVar55 = args.ray;
                              }
                            }
                            if ((_DAT_01f7bb20 & auVar125) == (undefined1  [16])0x0) {
                              *(float *)(pRVar48 + sVar47 * 4 + 0x80) = fVar238;
                            }
                            else {
                              fVar238 = *(float *)(pRVar48 + sVar47 * 4 + 0x80);
                            }
                            *(undefined4 *)(local_1428 + lVar66 * 4 + -0x10) = 0;
                            valid.field_0.i[0] =
                                 -(uint)(auVar123._0_4_ <= fVar238) & valid.field_0.i[0];
                            valid.field_0.i[1] =
                                 -(uint)(auVar123._4_4_ <= fVar238) & valid.field_0.i[1];
                            valid.field_0.i[2] =
                                 -(uint)(auVar123._8_4_ <= fVar238) & valid.field_0.i[2];
                            valid.field_0.i[3] =
                                 -(uint)(auVar123._12_4_ <= fVar238) & valid.field_0.i[3];
                            iVar49 = movmskps((int)pRVar55,(undefined1  [16])valid.field_0);
                            uVar62 = local_1200;
                            uVar64 = local_1208;
                            uVar67 = local_1210;
                            aVar246 = bi_2.field_0;
                            fVar266 = local_10c8;
                            fVar263 = fStack_10c4;
                            fVar240 = fStack_10c0;
                            fVar244 = fStack_10bc;
                            fVar267 = local_10d8;
                            fVar245 = fStack_10d4;
                            fVar163 = fStack_10d0;
                            fVar172 = fStack_10cc;
                            fVar253 = local_10a8;
                            fVar195 = fStack_10a4;
                            fVar198 = fStack_10a0;
                            fVar201 = fStack_109c;
                            fVar256 = local_10b8;
                            fVar185 = fStack_10b4;
                            fVar196 = fStack_10b0;
                            fVar199 = fStack_10ac;
                            if (iVar49 == 0) break;
                            auVar146 = blendvps(_DAT_01f7a9f0,auVar123,
                                                (undefined1  [16])valid.field_0);
                            auVar159._4_4_ = auVar146._0_4_;
                            auVar159._0_4_ = auVar146._4_4_;
                            auVar159._8_4_ = auVar146._12_4_;
                            auVar159._12_4_ = auVar146._8_4_;
                            auVar109 = minps(auVar159,auVar146);
                            auVar126._0_8_ = auVar109._8_8_;
                            auVar126._8_4_ = auVar109._0_4_;
                            auVar126._12_4_ = auVar109._4_4_;
                            auVar109 = minps(auVar126,auVar109);
                            auVar127._0_8_ =
                                 CONCAT44(-(uint)(auVar109._4_4_ == auVar146._4_4_) &
                                          valid.field_0.i[1],
                                          -(uint)(auVar109._0_4_ == auVar146._0_4_) &
                                          valid.field_0.i[0]);
                            auVar127._8_4_ =
                                 -(uint)(auVar109._8_4_ == auVar146._8_4_) & valid.field_0.i[2];
                            auVar127._12_4_ =
                                 -(uint)(auVar109._12_4_ == auVar146._12_4_) & valid.field_0.i[3];
                            iVar49 = movmskps(iVar49,auVar127);
                            aVar101 = valid.field_0;
                            if (iVar49 != 0) {
                              aVar101.i[2] = auVar127._8_4_;
                              aVar101._0_8_ = auVar127._0_8_;
                              aVar101.i[3] = auVar127._12_4_;
                            }
                            uVar51 = movmskps(iVar49,(undefined1  [16])aVar101);
                            uVar62 = CONCAT44((int)((ulong)pRVar55 >> 0x20),uVar51);
                            lVar66 = 0;
                            if (uVar62 != 0) {
                              for (; (uVar62 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_11e0 = local_11e0 & local_11e0 - 1;
            } while (local_11e0 != 0);
          }
          local_1218 = local_1218 + 1;
        } while (local_1218 != local_1220);
      }
      local_1238 = *(float *)(ray + k * 4 + 0x80);
      fStack_1234 = local_1238;
      fStack_1230 = local_1238;
      fStack_122c = local_1238;
      fVar216 = local_1288;
      fVar183 = fStack_1284;
      fVar193 = fStack_1280;
      fVar214 = fStack_127c;
      fVar238 = local_1298;
      fVar217 = fStack_1294;
      fVar260 = fStack_1290;
      fVar108 = fStack_128c;
      fVar236 = local_11b8;
      fVar219 = fStack_11b4;
      fVar227 = fStack_11b0;
      fVar231 = fStack_11ac;
      fVar218 = local_11c8;
      fVar131 = fStack_11c4;
      fVar202 = fStack_11c0;
      fVar210 = fStack_11bc;
    }
    if (local_13b0 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }